

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  RTCFilterFunctionN p_Var9;
  code *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  long lVar70;
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [28];
  byte bVar79;
  ulong uVar80;
  ulong uVar81;
  uint uVar82;
  ulong uVar83;
  Geometry *pGVar84;
  long lVar85;
  bool bVar86;
  ulong uVar87;
  undefined4 uVar88;
  undefined8 uVar89;
  float fVar103;
  vint4 bi_2;
  undefined1 auVar90 [16];
  float fVar102;
  float fVar104;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar94 [16];
  undefined1 auVar101 [32];
  float fVar108;
  float fVar122;
  vint4 bi_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  vint4 ai;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [64];
  float fVar172;
  float fVar173;
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar174;
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  undefined1 auVar180 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar200 [32];
  undefined4 uVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar193 [64];
  undefined1 auVar198 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  RTCFilterFunctionNArguments args;
  int local_794;
  Primitive *local_790;
  Precalculations *local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 local_744;
  ulong local_740;
  undefined1 auStack_738 [24];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  ulong local_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined4 local_528;
  float local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  uint local_514;
  uint local_510;
  undefined1 local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  int local_1e0;
  int local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_160 [4];
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar175 [16];
  undefined1 auVar199 [16];
  
  local_788 = pre;
  PVar7 = prim[1];
  uVar80 = (ulong)(byte)PVar7;
  lVar70 = uVar80 * 0x19;
  fVar123 = *(float *)(prim + lVar70 + 0x12);
  auVar143 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar90._0_4_ = fVar123 * auVar143._0_4_;
  auVar90._4_4_ = fVar123 * auVar143._4_4_;
  auVar90._8_4_ = fVar123 * auVar143._8_4_;
  auVar90._12_4_ = fVar123 * auVar143._12_4_;
  auVar149._0_4_ = fVar123 * (ray->dir).field_0.m128[0];
  auVar149._4_4_ = fVar123 * (ray->dir).field_0.m128[1];
  auVar149._8_4_ = fVar123 * (ray->dir).field_0.m128[2];
  auVar149._12_4_ = fVar123 * (ray->dir).field_0.m128[3];
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 4 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 5 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar80 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar87 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + uVar80 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar87 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar198._4_4_ = auVar149._0_4_;
  auVar198._0_4_ = auVar149._0_4_;
  auVar198._8_4_ = auVar149._0_4_;
  auVar198._12_4_ = auVar149._0_4_;
  auVar110 = vshufps_avx(auVar149,auVar149,0x55);
  auVar91 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar123 = auVar91._0_4_;
  auVar187._0_4_ = fVar123 * auVar12._0_4_;
  fVar102 = auVar91._4_4_;
  auVar187._4_4_ = fVar102 * auVar12._4_4_;
  fVar103 = auVar91._8_4_;
  auVar187._8_4_ = fVar103 * auVar12._8_4_;
  fVar104 = auVar91._12_4_;
  auVar187._12_4_ = fVar104 * auVar12._12_4_;
  auVar183._0_4_ = auVar15._0_4_ * fVar123;
  auVar183._4_4_ = auVar15._4_4_ * fVar102;
  auVar183._8_4_ = auVar15._8_4_ * fVar103;
  auVar183._12_4_ = auVar15._12_4_ * fVar104;
  auVar167._0_4_ = auVar124._0_4_ * fVar123;
  auVar167._4_4_ = auVar124._4_4_ * fVar102;
  auVar167._8_4_ = auVar124._8_4_ * fVar103;
  auVar167._12_4_ = auVar124._12_4_ * fVar104;
  auVar91 = vfmadd231ps_fma(auVar187,auVar110,auVar11);
  auVar111 = vfmadd231ps_fma(auVar183,auVar110,auVar14);
  auVar110 = vfmadd231ps_fma(auVar167,auVar92,auVar110);
  auVar134 = vfmadd231ps_fma(auVar91,auVar198,auVar143);
  auVar111 = vfmadd231ps_fma(auVar111,auVar198,auVar13);
  auVar185 = ZEXT1664(auVar111);
  auVar140 = vfmadd231ps_fma(auVar110,auVar93,auVar198);
  auVar199._4_4_ = auVar90._0_4_;
  auVar199._0_4_ = auVar90._0_4_;
  auVar199._8_4_ = auVar90._0_4_;
  auVar199._12_4_ = auVar90._0_4_;
  auVar202 = ZEXT1664(auVar199);
  auVar110 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar123 = auVar91._0_4_;
  auVar150._0_4_ = fVar123 * auVar12._0_4_;
  fVar102 = auVar91._4_4_;
  auVar150._4_4_ = fVar102 * auVar12._4_4_;
  fVar103 = auVar91._8_4_;
  auVar150._8_4_ = fVar103 * auVar12._8_4_;
  fVar104 = auVar91._12_4_;
  auVar150._12_4_ = fVar104 * auVar12._12_4_;
  auVar109._0_4_ = auVar15._0_4_ * fVar123;
  auVar109._4_4_ = auVar15._4_4_ * fVar102;
  auVar109._8_4_ = auVar15._8_4_ * fVar103;
  auVar109._12_4_ = auVar15._12_4_ * fVar104;
  auVar91._0_4_ = auVar124._0_4_ * fVar123;
  auVar91._4_4_ = auVar124._4_4_ * fVar102;
  auVar91._8_4_ = auVar124._8_4_ * fVar103;
  auVar91._12_4_ = auVar124._12_4_ * fVar104;
  auVar11 = vfmadd231ps_fma(auVar150,auVar110,auVar11);
  auVar12 = vfmadd231ps_fma(auVar109,auVar110,auVar14);
  auVar14 = vfmadd231ps_fma(auVar91,auVar110,auVar92);
  auVar15 = vfmadd231ps_fma(auVar11,auVar199,auVar143);
  auVar92 = vfmadd231ps_fma(auVar12,auVar199,auVar13);
  auVar124 = vfmadd231ps_fma(auVar14,auVar199,auVar93);
  local_250._8_4_ = 0x7fffffff;
  local_250._0_8_ = 0x7fffffff7fffffff;
  local_250._12_4_ = 0x7fffffff;
  auVar143 = vandps_avx(auVar134,local_250);
  auVar139._8_4_ = 0x219392ef;
  auVar139._0_8_ = 0x219392ef219392ef;
  auVar139._12_4_ = 0x219392ef;
  auVar143 = vcmpps_avx(auVar143,auVar139,1);
  auVar11 = vblendvps_avx(auVar134,auVar139,auVar143);
  auVar143 = vandps_avx(auVar111,local_250);
  auVar143 = vcmpps_avx(auVar143,auVar139,1);
  auVar12 = vblendvps_avx(auVar111,auVar139,auVar143);
  auVar143 = vandps_avx(auVar140,local_250);
  auVar143 = vcmpps_avx(auVar143,auVar139,1);
  auVar143 = vblendvps_avx(auVar140,auVar139,auVar143);
  auVar13 = vrcpps_avx(auVar11);
  auVar164._8_4_ = 0x3f800000;
  auVar164._0_8_ = 0x3f8000003f800000;
  auVar164._12_4_ = 0x3f800000;
  auVar11 = vfnmadd213ps_fma(auVar11,auVar13,auVar164);
  auVar13 = vfmadd132ps_fma(auVar11,auVar13,auVar13);
  auVar11 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar11,auVar164);
  auVar14 = vfmadd132ps_fma(auVar12,auVar11,auVar11);
  auVar11 = vrcpps_avx(auVar143);
  auVar143 = vfnmadd213ps_fma(auVar143,auVar11,auVar164);
  auVar93 = vfmadd132ps_fma(auVar143,auVar11,auVar11);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar80 * 7 + 6);
  auVar143 = vpmovsxwd_avx(auVar143);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar143 = vsubps_avx(auVar143,auVar15);
  auVar140._0_4_ = auVar13._0_4_ * auVar143._0_4_;
  auVar140._4_4_ = auVar13._4_4_ * auVar143._4_4_;
  auVar140._8_4_ = auVar13._8_4_ * auVar143._8_4_;
  auVar140._12_4_ = auVar13._12_4_ * auVar143._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar80 * 9 + 6);
  auVar143 = vpmovsxwd_avx(auVar11);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar143 = vsubps_avx(auVar143,auVar15);
  auVar151._0_4_ = auVar13._0_4_ * auVar143._0_4_;
  auVar151._4_4_ = auVar13._4_4_ * auVar143._4_4_;
  auVar151._8_4_ = auVar13._8_4_ * auVar143._8_4_;
  auVar151._12_4_ = auVar13._12_4_ * auVar143._12_4_;
  auVar111._1_3_ = 0;
  auVar111[0] = PVar7;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar80 * -2 + 6);
  auVar143 = vpmovsxwd_avx(auVar13);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar143 = vsubps_avx(auVar143,auVar92);
  auVar168._0_4_ = auVar143._0_4_ * auVar14._0_4_;
  auVar168._4_4_ = auVar143._4_4_ * auVar14._4_4_;
  auVar168._8_4_ = auVar143._8_4_ * auVar14._8_4_;
  auVar168._12_4_ = auVar143._12_4_ * auVar14._12_4_;
  auVar143 = vcvtdq2ps_avx(auVar11);
  auVar143 = vsubps_avx(auVar143,auVar92);
  auVar110._0_4_ = auVar14._0_4_ * auVar143._0_4_;
  auVar110._4_4_ = auVar14._4_4_ * auVar143._4_4_;
  auVar110._8_4_ = auVar14._8_4_ * auVar143._8_4_;
  auVar110._12_4_ = auVar14._12_4_ * auVar143._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar87 + uVar80 + 6);
  auVar143 = vpmovsxwd_avx(auVar14);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar143 = vsubps_avx(auVar143,auVar124);
  auVar134._0_4_ = auVar93._0_4_ * auVar143._0_4_;
  auVar134._4_4_ = auVar93._4_4_ * auVar143._4_4_;
  auVar134._8_4_ = auVar93._8_4_ * auVar143._8_4_;
  auVar134._12_4_ = auVar93._12_4_ * auVar143._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar80 * 0x17 + 6);
  auVar143 = vpmovsxwd_avx(auVar15);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar143 = vsubps_avx(auVar143,auVar124);
  auVar92._0_4_ = auVar93._0_4_ * auVar143._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar143._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar143._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar143._12_4_;
  auVar143 = vpminsd_avx(auVar140,auVar151);
  auVar11 = vpminsd_avx(auVar168,auVar110);
  auVar143 = vmaxps_avx(auVar143,auVar11);
  auVar11 = vpminsd_avx(auVar134,auVar92);
  uVar88 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar175._4_4_ = uVar88;
  auVar175._0_4_ = uVar88;
  auVar175._8_4_ = uVar88;
  auVar175._12_4_ = uVar88;
  auVar180 = ZEXT1664(auVar175);
  auVar11 = vmaxps_avx(auVar11,auVar175);
  auVar143 = vmaxps_avx(auVar143,auVar11);
  local_260._0_4_ = auVar143._0_4_ * 0.99999964;
  local_260._4_4_ = auVar143._4_4_ * 0.99999964;
  local_260._8_4_ = auVar143._8_4_ * 0.99999964;
  local_260._12_4_ = auVar143._12_4_ * 0.99999964;
  auVar143 = vpmaxsd_avx(auVar140,auVar151);
  auVar11 = vpmaxsd_avx(auVar168,auVar110);
  auVar143 = vminps_avx(auVar143,auVar11);
  auVar11 = vpmaxsd_avx(auVar134,auVar92);
  fVar123 = ray->tfar;
  auVar124._4_4_ = fVar123;
  auVar124._0_4_ = fVar123;
  auVar124._8_4_ = fVar123;
  auVar124._12_4_ = fVar123;
  auVar11 = vminps_avx(auVar11,auVar124);
  auVar143 = vminps_avx(auVar143,auVar11);
  auVar93._0_4_ = auVar143._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar143._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar143._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar143._12_4_ * 1.0000004;
  auVar111[4] = PVar7;
  auVar111._5_3_ = 0;
  auVar111[8] = PVar7;
  auVar111._9_3_ = 0;
  auVar111[0xc] = PVar7;
  auVar111._13_3_ = 0;
  auVar11 = vpcmpgtd_avx(auVar111,_DAT_01f7fcf0);
  auVar143 = vcmpps_avx(local_260,auVar93,2);
  auVar143 = vandps_avx(auVar143,auVar11);
  uVar82 = vmovmskps_avx(auVar143);
  if (uVar82 == 0) {
    bVar86 = false;
  }
  else {
    uVar82 = uVar82 & 0xff;
    local_460 = mm_lookupmask_ps._16_8_;
    uStack_458 = mm_lookupmask_ps._24_8_;
    uStack_450 = mm_lookupmask_ps._16_8_;
    uStack_448 = mm_lookupmask_ps._24_8_;
    local_790 = prim;
    do {
      local_6a0 = auVar185._0_32_;
      local_6c0 = auVar180._0_32_;
      local_4e0 = auVar202._0_32_;
      lVar20 = 0;
      uVar87 = (ulong)uVar82;
      for (uVar80 = uVar87; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar87 = uVar87 - 1 & uVar87;
      local_744 = *(undefined4 *)(local_790 + lVar20 * 4 + 6);
      uVar80 = (ulong)(uint)((int)lVar20 << 6);
      local_648 = (ulong)*(uint *)(local_790 + 2);
      pGVar84 = (context->scene->geometries).items[*(uint *)(local_790 + 2)].ptr;
      pPVar1 = prim + uVar80 + lVar70 + 0x16;
      local_600 = *(undefined8 *)pPVar1;
      uStack_5f8 = *(undefined8 *)(pPVar1 + 8);
      if (uVar87 != 0) {
        uVar83 = uVar87 - 1 & uVar87;
        for (uVar81 = uVar87; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
        if (uVar83 != 0) {
          for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_540 = *(undefined1 (*) [16])(prim + uVar80 + lVar70 + 0x26);
      auVar91 = local_540;
      local_550 = *(undefined1 (*) [16])(prim + uVar80 + lVar70 + 0x36);
      _local_470 = *(undefined1 (*) [16])(prim + uVar80 + lVar70 + 0x46);
      iVar8 = (int)pGVar84[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar4 = (ray->org).field_0;
      auVar11 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar4);
      uVar88 = auVar11._0_4_;
      auVar135._4_4_ = uVar88;
      auVar135._0_4_ = uVar88;
      auVar135._8_4_ = uVar88;
      auVar135._12_4_ = uVar88;
      auVar143 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar5 = (pre->ray_space).vx.field_0;
      aVar6 = (pre->ray_space).vy.field_0;
      fVar123 = (pre->ray_space).vz.field_0.m128[0];
      fVar102 = (pre->ray_space).vz.field_0.m128[1];
      fVar103 = (pre->ray_space).vz.field_0.m128[2];
      fVar104 = (pre->ray_space).vz.field_0.m128[3];
      auVar152._0_4_ = auVar11._0_4_ * fVar123;
      auVar152._4_4_ = auVar11._4_4_ * fVar102;
      auVar152._8_4_ = auVar11._8_4_ * fVar103;
      auVar152._12_4_ = auVar11._12_4_ * fVar104;
      auVar143 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar6,auVar143);
      auVar15 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar5,auVar135);
      auVar143 = vblendps_avx(auVar15,*(undefined1 (*) [16])pPVar1,8);
      auVar12 = vsubps_avx(local_540,(undefined1  [16])aVar4);
      uVar88 = auVar12._0_4_;
      auVar153._4_4_ = uVar88;
      auVar153._0_4_ = uVar88;
      auVar153._8_4_ = uVar88;
      auVar153._12_4_ = uVar88;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar176._0_4_ = auVar12._0_4_ * fVar123;
      auVar176._4_4_ = auVar12._4_4_ * fVar102;
      auVar176._8_4_ = auVar12._8_4_ * fVar103;
      auVar176._12_4_ = auVar12._12_4_ * fVar104;
      auVar11 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar11);
      auVar93 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar5,auVar153);
      auVar11 = vblendps_avx(auVar93,local_540,8);
      auVar110 = local_550;
      auVar13 = vsubps_avx(local_550,(undefined1  [16])aVar4);
      uVar88 = auVar13._0_4_;
      auVar158._4_4_ = uVar88;
      auVar158._0_4_ = uVar88;
      auVar158._8_4_ = uVar88;
      auVar158._12_4_ = uVar88;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar188._0_4_ = auVar13._0_4_ * fVar123;
      auVar188._4_4_ = auVar13._4_4_ * fVar102;
      auVar188._8_4_ = auVar13._8_4_ * fVar103;
      auVar188._12_4_ = auVar13._12_4_ * fVar104;
      auVar12 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar12);
      auVar92 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar158);
      auVar12 = vblendps_avx(auVar92,local_550,8);
      local_4c0._0_16_ = (undefined1  [16])aVar4;
      auVar14 = vsubps_avx(_local_470,(undefined1  [16])aVar4);
      uVar88 = auVar14._0_4_;
      auVar165._4_4_ = uVar88;
      auVar165._0_4_ = uVar88;
      auVar165._8_4_ = uVar88;
      auVar165._12_4_ = uVar88;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar125._0_4_ = auVar14._0_4_ * fVar123;
      auVar125._4_4_ = auVar14._4_4_ * fVar102;
      auVar125._8_4_ = auVar14._8_4_ * fVar103;
      auVar125._12_4_ = auVar14._12_4_ * fVar104;
      auVar13 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar6,auVar13);
      auVar124 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar165);
      auVar13 = vblendps_avx(auVar124,_local_470,8);
      auVar143 = vandps_avx(auVar143,local_250);
      auVar11 = vandps_avx(auVar11,local_250);
      auVar14 = vmaxps_avx(auVar143,auVar11);
      auVar143 = vandps_avx(auVar12,local_250);
      auVar11 = vandps_avx(auVar13,local_250);
      auVar143 = vmaxps_avx(auVar143,auVar11);
      auVar143 = vmaxps_avx(auVar14,auVar143);
      auVar11 = vmovshdup_avx(auVar143);
      auVar11 = vmaxss_avx(auVar11,auVar143);
      auVar143 = vshufpd_avx(auVar143,auVar143,1);
      auVar143 = vmaxss_avx(auVar143,auVar11);
      lVar20 = (long)iVar8 * 0x44;
      auVar11 = vmovshdup_avx(auVar15);
      uVar89 = auVar11._0_8_;
      local_3e0._8_8_ = uVar89;
      local_3e0._0_8_ = uVar89;
      local_3e0._16_8_ = uVar89;
      local_3e0._24_8_ = uVar89;
      auVar11 = vmovshdup_avx(auVar93);
      uVar89 = auVar11._0_8_;
      local_2a0._8_8_ = uVar89;
      local_2a0._0_8_ = uVar89;
      local_2a0._16_8_ = uVar89;
      local_2a0._24_8_ = uVar89;
      local_320 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x908);
      uVar186 = auVar92._0_4_;
      local_680._4_4_ = uVar186;
      local_680._0_4_ = uVar186;
      local_680._8_4_ = uVar186;
      local_680._12_4_ = uVar186;
      local_680._16_4_ = uVar186;
      local_680._20_4_ = uVar186;
      local_680._24_4_ = uVar186;
      local_680._28_4_ = uVar186;
      auVar11 = vmovshdup_avx(auVar92);
      uVar89 = auVar11._0_8_;
      local_5a0._8_8_ = uVar89;
      local_5a0._0_8_ = uVar89;
      local_5a0._16_8_ = uVar89;
      local_5a0._24_8_ = uVar89;
      fVar123 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      auVar78 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      auVar11 = vmovshdup_avx(auVar124);
      local_580 = auVar11._0_8_;
      local_620 = auVar124._0_4_;
      auVar112._0_4_ = local_620 * fVar123;
      auVar112._4_4_ = local_620 * *(float *)(bspline_basis0 + lVar20 + 0xd90);
      auVar112._8_4_ = local_620 * *(float *)(bspline_basis0 + lVar20 + 0xd94);
      auVar112._12_4_ = local_620 * *(float *)(bspline_basis0 + lVar20 + 0xd98);
      auVar112._16_4_ = local_620 * *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      auVar112._20_4_ = local_620 * *(float *)(bspline_basis0 + lVar20 + 0xda0);
      auVar112._24_4_ = local_620 * *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar112._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar112,local_320,local_680);
      fVar172 = auVar11._0_4_;
      auVar148._0_4_ = fVar172 * fVar123;
      fVar173 = auVar11._4_4_;
      auVar148._4_4_ = fVar173 * *(float *)(bspline_basis0 + lVar20 + 0xd90);
      auVar148._8_4_ = fVar172 * *(float *)(bspline_basis0 + lVar20 + 0xd94);
      auVar148._12_4_ = fVar173 * *(float *)(bspline_basis0 + lVar20 + 0xd98);
      auVar148._16_4_ = fVar172 * *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      auVar148._20_4_ = fVar173 * *(float *)(bspline_basis0 + lVar20 + 0xda0);
      auVar148._24_4_ = fVar172 * *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar148._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar148,local_320,local_5a0);
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x484);
      uVar88 = auVar93._0_4_;
      local_640._4_4_ = uVar88;
      local_640._0_4_ = uVar88;
      local_640._8_4_ = uVar88;
      local_640._12_4_ = uVar88;
      local_640._16_4_ = uVar88;
      local_640._20_4_ = uVar88;
      local_640._24_4_ = uVar88;
      local_640._28_4_ = uVar88;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar112,local_640);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar112,local_2a0);
      auVar148 = *(undefined1 (*) [32])(bspline_basis0 + lVar20);
      local_4a0._0_4_ = auVar15._0_4_;
      local_5c0._4_4_ = (float)local_4a0;
      local_5c0._0_4_ = (float)local_4a0;
      local_5c0._8_4_ = (float)local_4a0;
      local_5c0._12_4_ = (float)local_4a0;
      local_5c0._16_4_ = (float)local_4a0;
      local_5c0._20_4_ = (float)local_4a0;
      local_5c0._24_4_ = (float)local_4a0;
      local_5c0._28_4_ = (float)local_4a0;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar148,local_5c0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar148,local_3e0);
      auVar137 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x908);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0xd8c);
      auVar193 = ZEXT3264(auVar100);
      fStack_61c = local_620;
      fStack_618 = local_620;
      fStack_614 = local_620;
      fStack_610 = local_620;
      fStack_60c = local_620;
      fStack_608 = local_620;
      fStack_604 = local_620;
      fVar174 = auVar100._0_4_;
      fVar181 = auVar100._4_4_;
      auVar118._4_4_ = fVar181 * local_620;
      auVar118._0_4_ = fVar174 * local_620;
      fVar182 = auVar100._8_4_;
      auVar118._8_4_ = fVar182 * local_620;
      fVar194 = auVar100._12_4_;
      auVar118._12_4_ = fVar194 * local_620;
      fVar195 = auVar100._16_4_;
      auVar118._16_4_ = fVar195 * local_620;
      fVar196 = auVar100._20_4_;
      auVar118._20_4_ = fVar196 * local_620;
      fVar197 = auVar100._24_4_;
      auVar118._24_4_ = fVar197 * local_620;
      auVar118._28_4_ = local_620;
      auVar13 = vfmadd231ps_fma(auVar118,auVar137,local_680);
      uStack_578 = local_580;
      uStack_570 = local_580;
      uStack_568 = local_580;
      auVar100._4_4_ = fVar173 * fVar181;
      auVar100._0_4_ = fVar172 * fVar174;
      auVar100._8_4_ = fVar172 * fVar182;
      auVar100._12_4_ = fVar173 * fVar194;
      auVar100._16_4_ = fVar172 * fVar195;
      auVar100._20_4_ = fVar173 * fVar196;
      auVar100._24_4_ = fVar172 * fVar197;
      auVar100._28_4_ = uVar186;
      auVar14 = vfmadd231ps_fma(auVar100,auVar137,local_5a0);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x484);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar100,local_640);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar100,local_2a0);
      auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar20);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar118,local_5c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar118,local_3e0);
      local_2c0 = ZEXT1632(auVar13);
      auVar113 = ZEXT1632(auVar12);
      auVar16 = vsubps_avx(local_2c0,auVar113);
      auVar157 = ZEXT3264(auVar16);
      _local_2e0 = ZEXT1632(auVar14);
      local_300 = ZEXT1632(auVar11);
      local_340 = vsubps_avx(_local_2e0,local_300);
      auVar95._0_4_ = auVar11._0_4_ * auVar16._0_4_;
      auVar95._4_4_ = auVar11._4_4_ * auVar16._4_4_;
      auVar95._8_4_ = auVar11._8_4_ * auVar16._8_4_;
      auVar95._12_4_ = auVar11._12_4_ * auVar16._12_4_;
      auVar95._16_4_ = auVar16._16_4_ * 0.0;
      auVar95._20_4_ = auVar16._20_4_ * 0.0;
      auVar95._24_4_ = auVar16._24_4_ * 0.0;
      auVar95._28_4_ = 0;
      fVar123 = local_340._0_4_;
      auVar114._0_4_ = auVar12._0_4_ * fVar123;
      fVar102 = local_340._4_4_;
      auVar114._4_4_ = auVar12._4_4_ * fVar102;
      fVar103 = local_340._8_4_;
      auVar114._8_4_ = auVar12._8_4_ * fVar103;
      fVar104 = local_340._12_4_;
      auVar114._12_4_ = auVar12._12_4_ * fVar104;
      fVar105 = local_340._16_4_;
      auVar114._16_4_ = fVar105 * 0.0;
      fVar106 = local_340._20_4_;
      auVar114._20_4_ = fVar106 * 0.0;
      fVar107 = local_340._24_4_;
      auVar114._24_4_ = fVar107 * 0.0;
      auVar114._28_4_ = 0;
      auVar95 = vsubps_avx(auVar95,auVar114);
      auVar11 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar89 = auVar11._0_8_;
      local_80._8_8_ = uVar89;
      local_80._0_8_ = uVar89;
      local_80._16_8_ = uVar89;
      local_80._24_8_ = uVar89;
      auVar12 = vpermilps_avx(local_540,0xff);
      uVar89 = auVar12._0_8_;
      local_a0._8_8_ = uVar89;
      local_a0._0_8_ = uVar89;
      local_a0._16_8_ = uVar89;
      local_a0._24_8_ = uVar89;
      auVar12 = vpermilps_avx(local_550,0xff);
      uVar89 = auVar12._0_8_;
      local_c0._8_8_ = uVar89;
      local_c0._0_8_ = uVar89;
      local_c0._16_8_ = uVar89;
      local_c0._24_8_ = uVar89;
      auVar12 = vpermilps_avx(_local_470,0xff);
      local_e0 = auVar12._0_8_;
      local_780._0_4_ = auVar78._0_4_;
      local_780._4_4_ = auVar78._4_4_;
      fStack_778 = auVar78._8_4_;
      fStack_774 = auVar78._12_4_;
      fStack_770 = auVar78._16_4_;
      fStack_76c = auVar78._20_4_;
      fStack_768 = auVar78._24_4_;
      fVar108 = auVar12._0_4_;
      fVar122 = auVar12._4_4_;
      auVar132._4_4_ = fVar122 * (float)local_780._4_4_;
      auVar132._0_4_ = fVar108 * (float)local_780._0_4_;
      auVar132._8_4_ = fVar108 * fStack_778;
      auVar132._12_4_ = fVar122 * fStack_774;
      auVar132._16_4_ = fVar108 * fStack_770;
      auVar132._20_4_ = fVar122 * fStack_76c;
      auVar132._24_4_ = fVar108 * fStack_768;
      auVar132._28_4_ = (float)local_4a0;
      auVar12 = vfmadd231ps_fma(auVar132,local_320,local_c0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar112,local_a0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar148,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar19._4_4_ = fVar181 * fVar122;
      auVar19._0_4_ = fVar174 * fVar108;
      auVar19._8_4_ = fVar182 * fVar108;
      auVar19._12_4_ = fVar194 * fVar122;
      auVar19._16_4_ = fVar195 * fVar108;
      auVar19._20_4_ = fVar196 * fVar122;
      auVar19._24_4_ = fVar197 * fVar108;
      auVar19._28_4_ = auVar148._28_4_;
      auVar13 = vfmadd231ps_fma(auVar19,auVar137,local_c0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar100,local_a0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar118,local_80);
      auVar101._4_4_ = fVar102 * fVar102;
      auVar101._0_4_ = fVar123 * fVar123;
      auVar101._8_4_ = fVar103 * fVar103;
      auVar101._12_4_ = fVar104 * fVar104;
      auVar101._16_4_ = fVar105 * fVar105;
      auVar101._20_4_ = fVar106 * fVar106;
      auVar101._24_4_ = fVar107 * fVar107;
      auVar101._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar101,auVar16,auVar16);
      auVar132 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar159._4_4_ = auVar132._4_4_ * auVar132._4_4_ * auVar11._4_4_;
      auVar159._0_4_ = auVar132._0_4_ * auVar132._0_4_ * auVar11._0_4_;
      auVar159._8_4_ = auVar132._8_4_ * auVar132._8_4_ * auVar11._8_4_;
      auVar159._12_4_ = auVar132._12_4_ * auVar132._12_4_ * auVar11._12_4_;
      auVar159._16_4_ = auVar132._16_4_ * auVar132._16_4_ * 0.0;
      auVar159._20_4_ = auVar132._20_4_ * auVar132._20_4_ * 0.0;
      auVar159._24_4_ = auVar132._24_4_ * auVar132._24_4_ * 0.0;
      auVar159._28_4_ = auVar132._28_4_;
      auVar17._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar17._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar17._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar17._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar17._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar17._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar17._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar17._28_4_ = auVar95._28_4_;
      auVar132 = vcmpps_avx(auVar17,auVar159,2);
      auVar96._0_4_ = (float)iVar8;
      fVar123 = auVar143._0_4_ * 4.7683716e-07;
      local_420 = (ulong)(uint)auVar96._0_4_;
      uStack_418 = 0;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar96._16_4_ = auVar96._0_4_;
      auVar96._20_4_ = auVar96._0_4_;
      auVar96._24_4_ = auVar96._0_4_;
      auVar96._28_4_ = auVar96._0_4_;
      auVar95 = vcmpps_avx(_DAT_01faff40,auVar96,1);
      auVar143 = vpermilps_avx(auVar15,0xaa);
      uVar89 = auVar143._0_8_;
      local_400._8_8_ = uVar89;
      local_400._0_8_ = uVar89;
      local_400._16_8_ = uVar89;
      local_400._24_8_ = uVar89;
      auVar11 = vpermilps_avx(auVar93,0xaa);
      uVar89 = auVar11._0_8_;
      local_280._8_8_ = uVar89;
      local_280._0_8_ = uVar89;
      local_280._16_8_ = uVar89;
      local_280._24_8_ = uVar89;
      auVar11 = vpermilps_avx(auVar92,0xaa);
      uVar89 = auVar11._0_8_;
      local_3c0._8_8_ = uVar89;
      local_3c0._0_8_ = uVar89;
      local_3c0._16_8_ = uVar89;
      local_3c0._24_8_ = uVar89;
      auVar11 = vpermilps_avx(auVar124,0xaa);
      uStack_498 = auVar11._0_8_;
      local_4a0 = uStack_498;
      auVar14 = _local_4a0;
      uStack_490 = uStack_498;
      uStack_488 = uStack_498;
      auVar19 = auVar95 & auVar132;
      local_720._0_16_ = ZEXT416((uint)fVar123);
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0x7f,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0xbf,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
      {
        bVar86 = false;
LAB_015c2066:
        auVar202 = ZEXT3264(local_4e0);
        auVar180 = ZEXT3264(local_6c0);
        auVar185 = ZEXT3264(local_6a0);
        auVar190 = ZEXT3264(local_680);
LAB_015c2633:
        auVar163 = ZEXT3264(local_5a0);
        auVar166 = ZEXT3264(CONCAT428(fStack_604,
                                      CONCAT424(fStack_608,
                                                CONCAT420(fStack_60c,
                                                          CONCAT416(fStack_610,
                                                                    CONCAT412(fStack_614,
                                                                              CONCAT48(fStack_618,
                                                                                       CONCAT44(
                                                  fStack_61c,local_620))))))));
        auVar171 = ZEXT3264(local_640);
LAB_015c264e:
        auVar121 = ZEXT3264(local_6e0);
        auVar138 = ZEXT3264(local_5c0);
      }
      else {
        local_700 = vandps_avx(auVar132,auVar95);
        local_4a0._0_4_ = auVar11._0_4_;
        local_4a0._4_4_ = auVar11._4_4_;
        auVar18._4_4_ = fVar181 * local_4a0._4_4_;
        auVar18._0_4_ = fVar174 * (float)local_4a0;
        auVar18._8_4_ = fVar182 * (float)local_4a0;
        auVar18._12_4_ = fVar194 * local_4a0._4_4_;
        auVar18._16_4_ = fVar195 * (float)local_4a0;
        auVar18._20_4_ = fVar196 * local_4a0._4_4_;
        auVar18._24_4_ = fVar197 * (float)local_4a0;
        auVar18._28_4_ = local_700._28_4_;
        auVar11 = vfmadd213ps_fma(auVar137,local_3c0,auVar18);
        auVar11 = vfmadd213ps_fma(auVar100,local_280,ZEXT1632(auVar11));
        auVar11 = vfmadd213ps_fma(auVar118,local_400,ZEXT1632(auVar11));
        local_360 = ZEXT1632(auVar11);
        auVar137._4_4_ = local_4a0._4_4_ * (float)local_780._4_4_;
        auVar137._0_4_ = (float)local_4a0 * (float)local_780._0_4_;
        auVar137._8_4_ = (float)local_4a0 * fStack_778;
        auVar137._12_4_ = local_4a0._4_4_ * fStack_774;
        auVar137._16_4_ = (float)local_4a0 * fStack_770;
        auVar137._20_4_ = local_4a0._4_4_ * fStack_76c;
        auVar137._24_4_ = (float)local_4a0 * fStack_768;
        auVar137._28_4_ = local_700._28_4_;
        auVar11 = vfmadd213ps_fma(local_320,local_3c0,auVar137);
        auVar11 = vfmadd213ps_fma(auVar112,local_280,ZEXT1632(auVar11));
        auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1694);
        auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1b18);
        fVar102 = *(float *)(bspline_basis0 + lVar20 + 0x1f9c);
        fVar103 = *(float *)(bspline_basis0 + lVar20 + 0x1fa0);
        fVar104 = *(float *)(bspline_basis0 + lVar20 + 0x1fa4);
        fVar105 = *(float *)(bspline_basis0 + lVar20 + 0x1fa8);
        fVar106 = *(float *)(bspline_basis0 + lVar20 + 0x1fac);
        fVar107 = *(float *)(bspline_basis0 + lVar20 + 0x1fb0);
        fVar108 = *(float *)(bspline_basis0 + lVar20 + 0x1fb4);
        auVar200._4_4_ = local_620 * fVar103;
        auVar200._0_4_ = local_620 * fVar102;
        auVar200._8_4_ = local_620 * fVar104;
        auVar200._12_4_ = local_620 * fVar105;
        auVar200._16_4_ = local_620 * fVar106;
        auVar200._20_4_ = local_620 * fVar107;
        auVar200._24_4_ = local_620 * fVar108;
        auVar200._28_4_ = auVar16._28_4_;
        auVar169._0_4_ = fVar172 * fVar102;
        auVar169._4_4_ = fVar173 * fVar103;
        auVar169._8_4_ = fVar172 * fVar104;
        auVar169._12_4_ = fVar173 * fVar105;
        auVar169._16_4_ = fVar172 * fVar106;
        auVar169._20_4_ = fVar173 * fVar107;
        auVar169._24_4_ = fVar172 * fVar108;
        auVar169._28_4_ = 0;
        auVar184._0_4_ = fVar102 * (float)local_4a0;
        auVar184._4_4_ = fVar103 * local_4a0._4_4_;
        auVar184._8_4_ = fVar104 * (float)local_4a0;
        auVar184._12_4_ = fVar105 * local_4a0._4_4_;
        auVar184._16_4_ = fVar106 * (float)local_4a0;
        auVar184._20_4_ = fVar107 * local_4a0._4_4_;
        auVar184._24_4_ = fVar108 * (float)local_4a0;
        auVar184._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar200,auVar100,local_680);
        auVar93 = vfmadd231ps_fma(auVar169,auVar100,local_5a0);
        auVar92 = vfmadd231ps_fma(auVar184,local_3c0,auVar100);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar137,local_640);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar137,local_2a0);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_280,auVar137);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,local_5c0);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar112,local_3e0);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_400,auVar112);
        fVar102 = *(float *)(bspline_basis1 + lVar20 + 0x1f9c);
        fVar103 = *(float *)(bspline_basis1 + lVar20 + 0x1fa0);
        fVar104 = *(float *)(bspline_basis1 + lVar20 + 0x1fa4);
        fVar105 = *(float *)(bspline_basis1 + lVar20 + 0x1fa8);
        fVar106 = *(float *)(bspline_basis1 + lVar20 + 0x1fac);
        fVar107 = *(float *)(bspline_basis1 + lVar20 + 0x1fb0);
        fVar108 = *(float *)(bspline_basis1 + lVar20 + 0x1fb4);
        auVar160._4_4_ = local_620 * fVar103;
        auVar160._0_4_ = local_620 * fVar102;
        auVar160._8_4_ = local_620 * fVar104;
        auVar160._12_4_ = local_620 * fVar105;
        auVar160._16_4_ = local_620 * fVar106;
        auVar160._20_4_ = local_620 * fVar107;
        auVar160._24_4_ = local_620 * fVar108;
        auVar160._28_4_ = local_620;
        auVar21._4_4_ = fVar173 * fVar103;
        auVar21._0_4_ = fVar172 * fVar102;
        auVar21._8_4_ = fVar172 * fVar104;
        auVar21._12_4_ = fVar173 * fVar105;
        auVar21._16_4_ = fVar172 * fVar106;
        auVar21._20_4_ = fVar173 * fVar107;
        auVar21._24_4_ = fVar172 * fVar108;
        auVar21._28_4_ = fVar173;
        auVar22._4_4_ = fVar103 * local_4a0._4_4_;
        auVar22._0_4_ = fVar102 * (float)local_4a0;
        auVar22._8_4_ = fVar104 * (float)local_4a0;
        auVar22._12_4_ = fVar105 * local_4a0._4_4_;
        auVar22._16_4_ = fVar106 * (float)local_4a0;
        auVar22._20_4_ = fVar107 * local_4a0._4_4_;
        auVar22._24_4_ = fVar108 * (float)local_4a0;
        auVar22._28_4_ = auVar143._4_4_;
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1b18);
        auVar143 = vfmadd231ps_fma(auVar160,auVar112,local_680);
        auVar124 = vfmadd231ps_fma(auVar21,auVar112,local_5a0);
        auVar111 = vfmadd231ps_fma(auVar22,auVar112,local_3c0);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1694);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar112,local_640);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar112,local_2a0);
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_280,auVar112);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1210);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar112,local_5c0);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar112,local_3e0);
        auVar115._8_4_ = 0x7fffffff;
        auVar115._0_8_ = 0x7fffffff7fffffff;
        auVar115._12_4_ = 0x7fffffff;
        auVar115._16_4_ = 0x7fffffff;
        auVar115._20_4_ = 0x7fffffff;
        auVar115._24_4_ = 0x7fffffff;
        auVar115._28_4_ = 0x7fffffff;
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_400,auVar112);
        auVar112 = vandps_avx(ZEXT1632(auVar15),auVar115);
        auVar137 = vandps_avx(ZEXT1632(auVar93),auVar115);
        auVar137 = vmaxps_avx(auVar112,auVar137);
        auVar112 = vandps_avx(ZEXT1632(auVar92),auVar115);
        auVar112 = vmaxps_avx(auVar137,auVar112);
        auVar130._4_4_ = fVar123;
        auVar130._0_4_ = fVar123;
        auVar130._8_4_ = fVar123;
        auVar130._12_4_ = fVar123;
        auVar130._16_4_ = fVar123;
        auVar130._20_4_ = fVar123;
        auVar130._24_4_ = fVar123;
        auVar130._28_4_ = fVar123;
        auVar112 = vcmpps_avx(auVar112,auVar130,1);
        auVar100 = vblendvps_avx(ZEXT1632(auVar15),auVar16,auVar112);
        auVar118 = vblendvps_avx(ZEXT1632(auVar93),local_340,auVar112);
        auVar112 = vandps_avx(ZEXT1632(auVar143),auVar115);
        auVar137 = vandps_avx(ZEXT1632(auVar124),auVar115);
        auVar132 = vmaxps_avx(auVar112,auVar137);
        auVar112 = vandps_avx(ZEXT1632(auVar111),auVar115);
        auVar112 = vmaxps_avx(auVar132,auVar112);
        auVar95 = vcmpps_avx(auVar112,auVar130,1);
        auVar112 = vblendvps_avx(ZEXT1632(auVar143),auVar16,auVar95);
        auVar132 = vblendvps_avx(ZEXT1632(auVar124),local_340,auVar95);
        auVar143 = vfmadd213ps_fma(auVar148,local_400,ZEXT1632(auVar11));
        auVar11 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar118,auVar118);
        auVar16 = vrsqrtps_avx(ZEXT1632(auVar11));
        fVar123 = auVar16._0_4_;
        fVar102 = auVar16._4_4_;
        fVar103 = auVar16._8_4_;
        fVar104 = auVar16._12_4_;
        fVar105 = auVar16._16_4_;
        fVar106 = auVar16._20_4_;
        fVar107 = auVar16._24_4_;
        auVar23._4_4_ = fVar102 * fVar102 * fVar102 * auVar11._4_4_ * -0.5;
        auVar23._0_4_ = fVar123 * fVar123 * fVar123 * auVar11._0_4_ * -0.5;
        auVar23._8_4_ = fVar103 * fVar103 * fVar103 * auVar11._8_4_ * -0.5;
        auVar23._12_4_ = fVar104 * fVar104 * fVar104 * auVar11._12_4_ * -0.5;
        auVar23._16_4_ = fVar105 * fVar105 * fVar105 * -0.0;
        auVar23._20_4_ = fVar106 * fVar106 * fVar106 * -0.0;
        auVar23._24_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar23._28_4_ = 0;
        auVar146._8_4_ = 0x3fc00000;
        auVar146._0_8_ = 0x3fc000003fc00000;
        auVar146._12_4_ = 0x3fc00000;
        auVar146._16_4_ = 0x3fc00000;
        auVar146._20_4_ = 0x3fc00000;
        auVar146._24_4_ = 0x3fc00000;
        auVar146._28_4_ = 0x3fc00000;
        auVar11 = vfmadd231ps_fma(auVar23,auVar146,auVar16);
        fVar123 = auVar11._0_4_;
        fVar102 = auVar11._4_4_;
        auVar24._4_4_ = auVar118._4_4_ * fVar102;
        auVar24._0_4_ = auVar118._0_4_ * fVar123;
        fVar103 = auVar11._8_4_;
        auVar24._8_4_ = auVar118._8_4_ * fVar103;
        fVar104 = auVar11._12_4_;
        auVar24._12_4_ = auVar118._12_4_ * fVar104;
        auVar24._16_4_ = auVar118._16_4_ * 0.0;
        auVar24._20_4_ = auVar118._20_4_ * 0.0;
        auVar24._24_4_ = auVar118._24_4_ * 0.0;
        auVar24._28_4_ = auVar16._28_4_;
        auVar16._4_4_ = -auVar100._4_4_ * fVar102;
        auVar16._0_4_ = -auVar100._0_4_ * fVar123;
        auVar16._8_4_ = -auVar100._8_4_ * fVar103;
        auVar16._12_4_ = -auVar100._12_4_ * fVar104;
        auVar16._16_4_ = -auVar100._16_4_ * 0.0;
        auVar16._20_4_ = -auVar100._20_4_ * 0.0;
        auVar16._24_4_ = -auVar100._24_4_ * 0.0;
        auVar16._28_4_ = auVar137._28_4_;
        auVar11 = vfmadd213ps_fma(auVar112,auVar112,ZEXT832(0) << 0x20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar132,auVar132);
        auVar137 = vrsqrtps_avx(ZEXT1632(auVar11));
        auVar25._28_4_ = auVar95._28_4_;
        auVar25._0_28_ =
             ZEXT1628(CONCAT412(fVar104 * 0.0,
                                CONCAT48(fVar103 * 0.0,CONCAT44(fVar102 * 0.0,fVar123 * 0.0))));
        fVar123 = auVar137._0_4_;
        fVar102 = auVar137._4_4_;
        fVar103 = auVar137._8_4_;
        fVar104 = auVar137._12_4_;
        fVar105 = auVar137._16_4_;
        fVar106 = auVar137._20_4_;
        fVar107 = auVar137._24_4_;
        auVar26._4_4_ = fVar102 * fVar102 * fVar102 * auVar11._4_4_ * -0.5;
        auVar26._0_4_ = fVar123 * fVar123 * fVar123 * auVar11._0_4_ * -0.5;
        auVar26._8_4_ = fVar103 * fVar103 * fVar103 * auVar11._8_4_ * -0.5;
        auVar26._12_4_ = fVar104 * fVar104 * fVar104 * auVar11._12_4_ * -0.5;
        auVar26._16_4_ = fVar105 * fVar105 * fVar105 * -0.0;
        auVar26._20_4_ = fVar106 * fVar106 * fVar106 * -0.0;
        auVar26._24_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar26._28_4_ = 0;
        auVar11 = vfmadd231ps_fma(auVar26,auVar146,auVar137);
        fVar123 = auVar11._0_4_;
        fVar102 = auVar11._4_4_;
        auVar27._4_4_ = auVar132._4_4_ * fVar102;
        auVar27._0_4_ = auVar132._0_4_ * fVar123;
        fVar103 = auVar11._8_4_;
        auVar27._8_4_ = auVar132._8_4_ * fVar103;
        fVar104 = auVar11._12_4_;
        auVar27._12_4_ = auVar132._12_4_ * fVar104;
        auVar27._16_4_ = auVar132._16_4_ * 0.0;
        auVar27._20_4_ = auVar132._20_4_ * 0.0;
        auVar27._24_4_ = auVar132._24_4_ * 0.0;
        auVar27._28_4_ = 0;
        auVar28._4_4_ = -auVar112._4_4_ * fVar102;
        auVar28._0_4_ = -auVar112._0_4_ * fVar123;
        auVar28._8_4_ = -auVar112._8_4_ * fVar103;
        auVar28._12_4_ = -auVar112._12_4_ * fVar104;
        auVar28._16_4_ = -auVar112._16_4_ * 0.0;
        auVar28._20_4_ = -auVar112._20_4_ * 0.0;
        auVar28._24_4_ = -auVar112._24_4_ * 0.0;
        auVar28._28_4_ = auVar132._28_4_;
        auVar29._28_4_ = auVar137._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar104 * 0.0,
                                CONCAT48(fVar103 * 0.0,CONCAT44(fVar102 * 0.0,fVar123 * 0.0))));
        auVar11 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar12),auVar113);
        auVar112 = ZEXT1632(auVar12);
        auVar15 = vfmadd213ps_fma(auVar16,auVar112,local_300);
        auVar93 = vfmadd213ps_fma(auVar25,auVar112,ZEXT1632(auVar143));
        auVar134 = vfnmadd213ps_fma(auVar24,auVar112,auVar113);
        auVar92 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar13),local_2c0);
        auVar140 = vfnmadd213ps_fma(auVar16,auVar112,local_300);
        auVar112 = ZEXT1632(auVar13);
        auVar124 = vfmadd213ps_fma(auVar28,auVar112,_local_2e0);
        auVar200 = ZEXT1632(auVar12);
        auVar139 = vfnmadd231ps_fma(ZEXT1632(auVar143),auVar200,auVar25);
        auVar111 = vfmadd213ps_fma(auVar29,auVar112,local_360);
        auVar90 = vfnmadd213ps_fma(auVar27,auVar112,local_2c0);
        auVar109 = vfnmadd213ps_fma(auVar28,auVar112,_local_2e0);
        local_440 = ZEXT1632(auVar13);
        auVar149 = vfnmadd231ps_fma(local_360,local_440,auVar29);
        auVar112 = vsubps_avx(ZEXT1632(auVar124),ZEXT1632(auVar140));
        auVar137 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar139));
        auVar113._4_4_ = auVar139._4_4_ * auVar112._4_4_;
        auVar113._0_4_ = auVar139._0_4_ * auVar112._0_4_;
        auVar113._8_4_ = auVar139._8_4_ * auVar112._8_4_;
        auVar113._12_4_ = auVar139._12_4_ * auVar112._12_4_;
        auVar113._16_4_ = auVar112._16_4_ * 0.0;
        auVar113._20_4_ = auVar112._20_4_ * 0.0;
        auVar113._24_4_ = auVar112._24_4_ * 0.0;
        auVar113._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar140),auVar137);
        auVar30._4_4_ = auVar134._4_4_ * auVar137._4_4_;
        auVar30._0_4_ = auVar134._0_4_ * auVar137._0_4_;
        auVar30._8_4_ = auVar134._8_4_ * auVar137._8_4_;
        auVar30._12_4_ = auVar134._12_4_ * auVar137._12_4_;
        auVar30._16_4_ = auVar137._16_4_ * 0.0;
        auVar30._20_4_ = auVar137._20_4_ * 0.0;
        auVar30._24_4_ = auVar137._24_4_ * 0.0;
        auVar30._28_4_ = auVar137._28_4_;
        auVar95 = ZEXT1632(auVar134);
        auVar137 = vsubps_avx(ZEXT1632(auVar92),auVar95);
        auVar143 = vfmsub231ps_fma(auVar30,ZEXT1632(auVar139),auVar137);
        auVar31._4_4_ = auVar140._4_4_ * auVar137._4_4_;
        auVar31._0_4_ = auVar140._0_4_ * auVar137._0_4_;
        auVar31._8_4_ = auVar140._8_4_ * auVar137._8_4_;
        auVar31._12_4_ = auVar140._12_4_ * auVar137._12_4_;
        auVar31._16_4_ = auVar137._16_4_ * 0.0;
        auVar31._20_4_ = auVar137._20_4_ * 0.0;
        auVar31._24_4_ = auVar137._24_4_ * 0.0;
        auVar31._28_4_ = auVar137._28_4_;
        auVar134 = vfmsub231ps_fma(auVar31,auVar95,auVar112);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar134),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
        auStack_4f0 = auVar148._16_16_;
        local_500 = local_700._16_16_;
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar101 = vcmpps_avx(ZEXT1632(auVar143),ZEXT832(0) << 0x20,2);
        auVar112 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar11),auVar101);
        auVar148 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar15),auVar101);
        auVar137 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar93),auVar101);
        auVar100 = vblendvps_avx(auVar95,ZEXT1632(auVar92),auVar101);
        auVar118 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar124),auVar101);
        auVar132 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar111),auVar101);
        auVar95 = vblendvps_avx(ZEXT1632(auVar92),auVar95,auVar101);
        auVar16 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar140),auVar101);
        auVar143 = vpackssdw_avx(local_700._0_16_,local_700._16_16_);
        auVar19 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar139),auVar101);
        auVar159 = vsubps_avx(auVar95,auVar112);
        auVar16 = vsubps_avx(auVar16,auVar148);
        auVar17 = vsubps_avx(auVar19,auVar137);
        auVar113 = vsubps_avx(auVar112,auVar100);
        auVar114 = vsubps_avx(auVar148,auVar118);
        auVar18 = vsubps_avx(auVar137,auVar132);
        auVar32._4_4_ = auVar17._4_4_ * auVar112._4_4_;
        auVar32._0_4_ = auVar17._0_4_ * auVar112._0_4_;
        auVar32._8_4_ = auVar17._8_4_ * auVar112._8_4_;
        auVar32._12_4_ = auVar17._12_4_ * auVar112._12_4_;
        auVar32._16_4_ = auVar17._16_4_ * auVar112._16_4_;
        auVar32._20_4_ = auVar17._20_4_ * auVar112._20_4_;
        auVar32._24_4_ = auVar17._24_4_ * auVar112._24_4_;
        auVar32._28_4_ = auVar19._28_4_;
        auVar11 = vfmsub231ps_fma(auVar32,auVar137,auVar159);
        auVar33._4_4_ = auVar159._4_4_ * auVar148._4_4_;
        auVar33._0_4_ = auVar159._0_4_ * auVar148._0_4_;
        auVar33._8_4_ = auVar159._8_4_ * auVar148._8_4_;
        auVar33._12_4_ = auVar159._12_4_ * auVar148._12_4_;
        auVar33._16_4_ = auVar159._16_4_ * auVar148._16_4_;
        auVar33._20_4_ = auVar159._20_4_ * auVar148._20_4_;
        auVar33._24_4_ = auVar159._24_4_ * auVar148._24_4_;
        auVar33._28_4_ = auVar95._28_4_;
        auVar13 = vfmsub231ps_fma(auVar33,auVar112,auVar16);
        auVar157 = ZEXT3264(auVar148);
        auVar193 = ZEXT864(0) << 0x20;
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar97._0_4_ = auVar16._0_4_ * auVar137._0_4_;
        auVar97._4_4_ = auVar16._4_4_ * auVar137._4_4_;
        auVar97._8_4_ = auVar16._8_4_ * auVar137._8_4_;
        auVar97._12_4_ = auVar16._12_4_ * auVar137._12_4_;
        auVar97._16_4_ = auVar16._16_4_ * auVar137._16_4_;
        auVar97._20_4_ = auVar16._20_4_ * auVar137._20_4_;
        auVar97._24_4_ = auVar16._24_4_ * auVar137._24_4_;
        auVar97._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar97,auVar148,auVar17);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar98._0_4_ = auVar18._0_4_ * auVar100._0_4_;
        auVar98._4_4_ = auVar18._4_4_ * auVar100._4_4_;
        auVar98._8_4_ = auVar18._8_4_ * auVar100._8_4_;
        auVar98._12_4_ = auVar18._12_4_ * auVar100._12_4_;
        auVar98._16_4_ = auVar18._16_4_ * auVar100._16_4_;
        auVar98._20_4_ = auVar18._20_4_ * auVar100._20_4_;
        auVar98._24_4_ = auVar18._24_4_ * auVar100._24_4_;
        auVar98._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar98,auVar113,auVar132);
        auVar34._4_4_ = auVar114._4_4_ * auVar132._4_4_;
        auVar34._0_4_ = auVar114._0_4_ * auVar132._0_4_;
        auVar34._8_4_ = auVar114._8_4_ * auVar132._8_4_;
        auVar34._12_4_ = auVar114._12_4_ * auVar132._12_4_;
        auVar34._16_4_ = auVar114._16_4_ * auVar132._16_4_;
        auVar34._20_4_ = auVar114._20_4_ * auVar132._20_4_;
        auVar34._24_4_ = auVar114._24_4_ * auVar132._24_4_;
        auVar34._28_4_ = auVar132._28_4_;
        auVar15 = vfmsub231ps_fma(auVar34,auVar118,auVar18);
        auVar35._4_4_ = auVar113._4_4_ * auVar118._4_4_;
        auVar35._0_4_ = auVar113._0_4_ * auVar118._0_4_;
        auVar35._8_4_ = auVar113._8_4_ * auVar118._8_4_;
        auVar35._12_4_ = auVar113._12_4_ * auVar118._12_4_;
        auVar35._16_4_ = auVar113._16_4_ * auVar118._16_4_;
        auVar35._20_4_ = auVar113._20_4_ * auVar118._20_4_;
        auVar35._24_4_ = auVar113._24_4_ * auVar118._24_4_;
        auVar35._28_4_ = auVar118._28_4_;
        auVar93 = vfmsub231ps_fma(auVar35,auVar114,auVar100);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar100 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
        auVar100 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
        auVar143 = vpand_avx(auVar143,auVar11);
        auVar100 = vpmovsxwd_avx2(auVar143);
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) {
LAB_015c3896:
          auVar163 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar202 = ZEXT3264(local_4e0);
          auVar180 = ZEXT3264(local_6c0);
        }
        else {
          auVar36._4_4_ = auVar16._4_4_ * auVar18._4_4_;
          auVar36._0_4_ = auVar16._0_4_ * auVar18._0_4_;
          auVar36._8_4_ = auVar16._8_4_ * auVar18._8_4_;
          auVar36._12_4_ = auVar16._12_4_ * auVar18._12_4_;
          auVar36._16_4_ = auVar16._16_4_ * auVar18._16_4_;
          auVar36._20_4_ = auVar16._20_4_ * auVar18._20_4_;
          auVar36._24_4_ = auVar16._24_4_ * auVar18._24_4_;
          auVar36._28_4_ = auVar100._28_4_;
          auVar124 = vfmsub231ps_fma(auVar36,auVar114,auVar17);
          auVar116._0_4_ = auVar113._0_4_ * auVar17._0_4_;
          auVar116._4_4_ = auVar113._4_4_ * auVar17._4_4_;
          auVar116._8_4_ = auVar113._8_4_ * auVar17._8_4_;
          auVar116._12_4_ = auVar113._12_4_ * auVar17._12_4_;
          auVar116._16_4_ = auVar113._16_4_ * auVar17._16_4_;
          auVar116._20_4_ = auVar113._20_4_ * auVar17._20_4_;
          auVar116._24_4_ = auVar113._24_4_ * auVar17._24_4_;
          auVar116._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar116,auVar159,auVar18);
          auVar37._4_4_ = auVar159._4_4_ * auVar114._4_4_;
          auVar37._0_4_ = auVar159._0_4_ * auVar114._0_4_;
          auVar37._8_4_ = auVar159._8_4_ * auVar114._8_4_;
          auVar37._12_4_ = auVar159._12_4_ * auVar114._12_4_;
          auVar37._16_4_ = auVar159._16_4_ * auVar114._16_4_;
          auVar37._20_4_ = auVar159._20_4_ * auVar114._20_4_;
          auVar37._24_4_ = auVar159._24_4_ * auVar114._24_4_;
          auVar37._28_4_ = auVar159._28_4_;
          auVar111 = vfmsub231ps_fma(auVar37,auVar113,auVar16);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar111));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar124),_DAT_01faff00);
          auVar100 = vrcpps_avx(ZEXT1632(auVar93));
          auVar189._8_4_ = 0x3f800000;
          auVar189._0_8_ = 0x3f8000003f800000;
          auVar189._12_4_ = 0x3f800000;
          auVar189._16_4_ = 0x3f800000;
          auVar189._20_4_ = 0x3f800000;
          auVar189._24_4_ = 0x3f800000;
          auVar189._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar100,ZEXT1632(auVar93),auVar189);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar100,auVar100);
          auVar38._4_4_ = auVar111._4_4_ * auVar137._4_4_;
          auVar38._0_4_ = auVar111._0_4_ * auVar137._0_4_;
          auVar38._8_4_ = auVar111._8_4_ * auVar137._8_4_;
          auVar38._12_4_ = auVar111._12_4_ * auVar137._12_4_;
          auVar38._16_4_ = auVar137._16_4_ * 0.0;
          auVar38._20_4_ = auVar137._20_4_ * 0.0;
          auVar38._24_4_ = auVar137._24_4_ * 0.0;
          auVar38._28_4_ = auVar137._28_4_;
          auVar92 = vfmadd231ps_fma(auVar38,auVar148,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar124),auVar112);
          fVar102 = auVar11._0_4_;
          fVar103 = auVar11._4_4_;
          fVar104 = auVar11._8_4_;
          fVar105 = auVar11._12_4_;
          auVar39._28_4_ = auVar148._28_4_;
          auVar39._0_28_ =
               ZEXT1628(CONCAT412(fVar105 * auVar92._12_4_,
                                  CONCAT48(fVar104 * auVar92._8_4_,
                                           CONCAT44(fVar103 * auVar92._4_4_,fVar102 * auVar92._0_4_)
                                          )));
          auVar157 = ZEXT3264(auVar39);
          auVar11 = vpermilps_avx((undefined1  [16])aVar4,0xff);
          auVar99._0_8_ = auVar11._0_8_;
          auVar99._8_8_ = auVar99._0_8_;
          auVar99._16_8_ = auVar99._0_8_;
          auVar99._24_8_ = auVar99._0_8_;
          fVar123 = ray->tfar;
          auVar117._4_4_ = fVar123;
          auVar117._0_4_ = fVar123;
          auVar117._8_4_ = fVar123;
          auVar117._12_4_ = fVar123;
          auVar117._16_4_ = fVar123;
          auVar117._20_4_ = fVar123;
          auVar117._24_4_ = fVar123;
          auVar117._28_4_ = fVar123;
          auVar148 = vcmpps_avx(auVar99,auVar39,2);
          auVar137 = vcmpps_avx(auVar39,auVar117,2);
          auVar148 = vandps_avx(auVar137,auVar148);
          auVar11 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
          auVar143 = vpand_avx(auVar143,auVar11);
          auVar148 = vpmovsxwd_avx2(auVar143);
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar148 >> 0x7f,0) == '\0') &&
                (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar148 >> 0xbf,0) == '\0') &&
              (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar148[0x1f]) goto LAB_015c3896;
          auVar148 = vcmpps_avx(ZEXT1632(auVar93),ZEXT832(0) << 0x20,4);
          auVar11 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
          auVar143 = vpand_avx(auVar143,auVar11);
          auVar148 = vpmovsxwd_avx2(auVar143);
          auVar163 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar202 = ZEXT3264(local_4e0);
          auVar180 = ZEXT3264(local_6c0);
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar148 >> 0x7f,0) != '\0') ||
                (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0xbf,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar148[0x1f] < '\0') {
            auVar100 = ZEXT1632(CONCAT412(fVar105 * auVar13._12_4_,
                                          CONCAT48(fVar104 * auVar13._8_4_,
                                                   CONCAT44(fVar103 * auVar13._4_4_,
                                                            fVar102 * auVar13._0_4_))));
            auVar118 = ZEXT1632(CONCAT412(fVar105 * auVar15._12_4_,
                                          CONCAT48(fVar104 * auVar15._8_4_,
                                                   CONCAT44(fVar103 * auVar15._4_4_,
                                                            fVar102 * auVar15._0_4_))));
            auVar147._8_4_ = 0x3f800000;
            auVar147._0_8_ = 0x3f8000003f800000;
            auVar147._12_4_ = 0x3f800000;
            auVar147._16_4_ = 0x3f800000;
            auVar147._20_4_ = 0x3f800000;
            auVar147._24_4_ = 0x3f800000;
            auVar147._28_4_ = 0x3f800000;
            auVar137 = vsubps_avx(auVar147,auVar100);
            auVar137 = vblendvps_avx(auVar137,auVar100,auVar101);
            auVar202 = ZEXT3264(auVar137);
            auVar137 = vsubps_avx(auVar147,auVar118);
            local_380 = vblendvps_avx(auVar137,auVar118,auVar101);
            auVar163 = ZEXT3264(auVar148);
            auVar180 = ZEXT3264(auVar39);
          }
        }
        auVar190 = ZEXT3264(local_680);
        auVar185 = ZEXT3264(auVar185._0_32_);
        auVar148 = auVar163._0_32_;
        _local_4a0 = auVar14;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar148 >> 0x7f,0) == '\0') &&
              (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar148 >> 0xbf,0) == '\0') &&
            (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar163[0x1f]) {
          bVar86 = false;
          goto LAB_015c2633;
        }
        auVar137 = vsubps_avx(local_440,auVar200);
        local_240 = auVar202._0_32_;
        auVar143 = vfmadd213ps_fma(auVar137,local_240,auVar200);
        fVar123 = pre->depth_scale;
        auVar40._4_4_ = (auVar143._4_4_ + auVar143._4_4_) * fVar123;
        auVar40._0_4_ = (auVar143._0_4_ + auVar143._0_4_) * fVar123;
        auVar40._8_4_ = (auVar143._8_4_ + auVar143._8_4_) * fVar123;
        auVar40._12_4_ = (auVar143._12_4_ + auVar143._12_4_) * fVar123;
        auVar40._16_4_ = fVar123 * 0.0;
        auVar40._20_4_ = fVar123 * 0.0;
        auVar40._24_4_ = fVar123 * 0.0;
        auVar40._28_4_ = 0;
        local_200 = auVar180._0_32_;
        auVar137 = vcmpps_avx(local_200,auVar40,6);
        auVar100 = auVar148 & auVar137;
        auVar163 = ZEXT3264(local_5a0);
        auVar166 = ZEXT3264(CONCAT428(local_620,
                                      CONCAT424(local_620,
                                                CONCAT420(local_620,
                                                          CONCAT416(local_620,
                                                                    CONCAT412(local_620,
                                                                              CONCAT48(local_620,
                                                                                       CONCAT44(
                                                  local_620,local_620))))))));
        auVar171 = ZEXT3264(local_640);
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          auVar119._8_4_ = 0xbf800000;
          auVar119._0_8_ = 0xbf800000bf800000;
          auVar119._12_4_ = 0xbf800000;
          auVar119._16_4_ = 0xbf800000;
          auVar119._20_4_ = 0xbf800000;
          auVar119._24_4_ = 0xbf800000;
          auVar119._28_4_ = 0xbf800000;
          auVar131._8_4_ = 0x40000000;
          auVar131._0_8_ = 0x4000000040000000;
          auVar131._12_4_ = 0x40000000;
          auVar131._16_4_ = 0x40000000;
          auVar131._20_4_ = 0x40000000;
          auVar131._24_4_ = 0x40000000;
          auVar131._28_4_ = 0x40000000;
          auVar143 = vfmadd213ps_fma(local_380,auVar131,auVar119);
          local_380 = ZEXT1632(auVar143);
          auVar100 = local_380;
          local_220 = ZEXT1632(auVar143);
          local_1e0 = 0;
          local_1dc = iVar8;
          local_1d0 = *(undefined8 *)pPVar1;
          uStack_1c8 = *(undefined8 *)(pPVar1 + 8);
          local_1c0 = local_540._0_8_;
          uStack_1b8 = local_540._8_8_;
          local_1b0 = local_550._0_8_;
          uStack_1a8 = local_550._8_8_;
          if ((pGVar84->mask & ray->mask) != 0) {
            _local_780 = ZEXT1632(CONCAT88(auVar12._8_8_,pGVar84));
            auVar121 = ZEXT3264(local_6e0);
            auVar138 = ZEXT3264(local_5c0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar86 = true, local_550 = auVar110, local_540 = auVar91,
               pGVar84->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar148 = vandps_avx(auVar137,auVar148);
              fVar123 = 1.0 / auVar96._0_4_;
              local_160[0] = fVar123 * (auVar202._0_4_ + 0.0);
              local_160[1] = fVar123 * (auVar202._4_4_ + 1.0);
              local_160[2] = fVar123 * (auVar202._8_4_ + 2.0);
              local_160[3] = fVar123 * (auVar202._12_4_ + 3.0);
              fStack_150 = fVar123 * (auVar202._16_4_ + 4.0);
              fStack_14c = fVar123 * (auVar202._20_4_ + 5.0);
              fStack_148 = fVar123 * (auVar202._24_4_ + 6.0);
              fStack_144 = auVar202._28_4_ + 7.0;
              local_380._0_8_ = auVar143._0_8_;
              local_380._8_8_ = auVar143._8_8_;
              local_140 = local_380._0_8_;
              uStack_138 = local_380._8_8_;
              uStack_130 = 0;
              uStack_128 = 0;
              local_120 = local_200;
              uVar82 = vmovmskps_avx(auVar148);
              local_380 = auVar100;
              if (uVar82 == 0) goto LAB_015c26fc;
              uVar80 = CONCAT44(0,uVar82 & 0xff);
              auStack_738 = auVar112._8_24_;
              local_740 = uVar80;
              lVar85 = 0;
              for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                lVar85 = lVar85 + 1;
              }
              local_500._0_4_ = ray->tfar;
              local_4e0 = local_240;
              local_6c0 = local_200;
              local_550 = auVar110;
              local_540 = auVar91;
              do {
                local_524 = local_160[lVar85];
                local_520 = *(undefined4 *)((long)&local_140 + lVar85 * 4);
                local_700._0_8_ = lVar85;
                ray->tfar = *(float *)(local_120 + lVar85 * 4);
                local_5f0.context = context->user;
                fVar123 = 1.0 - local_524;
                auVar143 = ZEXT416((uint)(local_524 * fVar123 * 4.0));
                auVar11 = vfnmsub213ss_fma(ZEXT416((uint)local_524),ZEXT416((uint)local_524),
                                           auVar143);
                auVar143 = vfmadd213ss_fma(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),auVar143);
                fVar123 = fVar123 * -fVar123 * 0.5;
                fVar102 = auVar11._0_4_ * 0.5;
                auVar157 = ZEXT464((uint)fVar102);
                fVar103 = auVar143._0_4_ * 0.5;
                fVar104 = local_524 * local_524 * 0.5;
                auVar141._0_4_ = fVar104 * (float)local_470._0_4_;
                auVar141._4_4_ = fVar104 * (float)local_470._4_4_;
                auVar141._8_4_ = fVar104 * fStack_468;
                auVar141._12_4_ = fVar104 * fStack_464;
                auVar126._4_4_ = fVar103;
                auVar126._0_4_ = fVar103;
                auVar126._8_4_ = fVar103;
                auVar126._12_4_ = fVar103;
                auVar143 = vfmadd132ps_fma(auVar126,auVar141,local_550);
                auVar142._4_4_ = fVar102;
                auVar142._0_4_ = fVar102;
                auVar142._8_4_ = fVar102;
                auVar142._12_4_ = fVar102;
                auVar143 = vfmadd132ps_fma(auVar142,auVar143,local_540);
                auVar127._4_4_ = fVar123;
                auVar127._0_4_ = fVar123;
                auVar127._8_4_ = fVar123;
                auVar127._12_4_ = fVar123;
                auVar75._8_8_ = uStack_5f8;
                auVar75._0_8_ = local_600;
                auVar143 = vfmadd132ps_fma(auVar127,auVar143,auVar75);
                local_530 = vmovlps_avx(auVar143);
                local_528 = vextractps_avx(auVar143,2);
                local_51c = local_744;
                local_518 = (int)local_648;
                local_514 = (local_5f0.context)->instID[0];
                local_510 = (local_5f0.context)->instPrimID[0];
                local_794 = -1;
                local_5f0.valid = &local_794;
                local_5f0.geometryUserPtr = *(void **)((long)local_780 + 0x18);
                local_5f0.ray = (RTCRayN *)ray;
                local_5f0.hit = (RTCHitN *)&local_530;
                local_5f0.N = 1;
                if (*(code **)((long)local_780 + 0x48) == (code *)0x0) {
LAB_015c29f2:
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                    auVar157 = ZEXT1664(auVar157._0_16_);
                    auVar193 = ZEXT1664(auVar193._0_16_);
                    (*p_Var9)(&local_5f0);
                    if (*local_5f0.valid == 0) goto LAB_015c2a3b;
                  }
                  bVar86 = true;
                  pre = local_788;
                  goto LAB_015c2066;
                }
                auVar157 = ZEXT464((uint)fVar102);
                auVar193 = ZEXT1664(auVar193._0_16_);
                (**(code **)((long)local_780 + 0x48))(&local_5f0);
                if (*local_5f0.valid != 0) goto LAB_015c29f2;
LAB_015c2a3b:
                ray->tfar = (float)local_500._0_4_;
                uVar81 = local_740 ^ 1L << (local_700._0_8_ & 0x3f);
                bVar86 = false;
                local_740 = uVar81;
                lVar85 = 0;
                for (uVar80 = uVar81; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000)
                {
                  lVar85 = lVar85 + 1;
                }
                auVar202 = ZEXT3264(local_4e0);
                auVar121 = ZEXT3264(local_6e0);
                auVar180 = ZEXT3264(local_6c0);
                auVar185 = ZEXT3264(local_6a0);
                auVar190 = ZEXT3264(local_680);
                auVar163 = ZEXT3264(local_5a0);
                auVar166 = ZEXT3264(CONCAT428(fStack_604,
                                              CONCAT424(fStack_608,
                                                        CONCAT420(fStack_60c,
                                                                  CONCAT416(fStack_610,
                                                                            CONCAT412(fStack_614,
                                                                                      CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                auVar171 = ZEXT3264(local_640);
                auVar138 = ZEXT3264(local_5c0);
                pre = local_788;
              } while (uVar81 != 0);
            }
            goto LAB_015c2657;
          }
          bVar86 = false;
          local_550 = auVar110;
          local_540 = auVar91;
          goto LAB_015c264e;
        }
LAB_015c26fc:
        auVar138 = ZEXT3264(local_5c0);
        bVar86 = false;
        auVar121 = ZEXT3264(local_6e0);
        local_550 = auVar110;
        local_540 = auVar91;
      }
LAB_015c2657:
      local_6e0 = auVar121._0_32_;
      if (8 < iVar8) {
        local_300._4_4_ = iVar8;
        local_300._0_4_ = iVar8;
        local_300._8_4_ = iVar8;
        local_300._12_4_ = iVar8;
        local_300._16_4_ = iVar8;
        local_300._20_4_ = iVar8;
        local_300._24_4_ = iVar8;
        local_300._28_4_ = iVar8;
        local_360._4_4_ = local_720._0_4_;
        local_360._0_4_ = local_720._0_4_;
        local_360._8_4_ = local_720._0_4_;
        local_360._12_4_ = local_720._0_4_;
        local_360._16_4_ = local_720._0_4_;
        local_360._20_4_ = local_720._0_4_;
        local_360._24_4_ = local_720._0_4_;
        local_360._28_4_ = local_720._0_4_;
        auVar143 = vpermilps_avx(local_4c0._0_16_,0xff);
        local_100 = auVar143._0_8_;
        uStack_f8 = local_100;
        uStack_f0 = local_100;
        uStack_e8 = local_100;
        local_420._0_4_ = 1.0 / (float)local_420;
        local_420._4_4_ = (float)local_420;
        uStack_418._0_4_ = (float)local_420;
        uStack_418._4_4_ = (float)local_420;
        fStack_410 = (float)local_420;
        fStack_40c = (float)local_420;
        fStack_408 = (float)local_420;
        fStack_404 = (float)local_420;
        lVar85 = 8;
        local_4e0 = auVar202._0_32_;
        local_6c0 = auVar180._0_32_;
        fVar123 = (float)local_580;
        fVar102 = local_580._4_4_;
        fVar103 = (float)uStack_578;
        fVar104 = uStack_578._4_4_;
        fVar105 = (float)uStack_570;
        fVar106 = uStack_570._4_4_;
        fVar107 = (float)uStack_568;
        do {
          auVar96 = auVar185._0_32_;
          local_6e0 = auVar121._0_32_;
          auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 * 4 + lVar20);
          auVar148 = *(undefined1 (*) [32])(lVar20 + 0x21aefac + lVar85 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar20 + 0x21af430 + lVar85 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar20 + 0x21af8b4 + lVar85 * 4);
          fVar108 = *(float *)*pauVar2;
          fVar122 = *(float *)(*pauVar2 + 4);
          fVar172 = *(float *)(*pauVar2 + 8);
          fVar173 = *(float *)(*pauVar2 + 0xc);
          fVar174 = *(float *)(*pauVar2 + 0x10);
          fVar181 = *(float *)(*pauVar2 + 0x14);
          fVar182 = *(float *)(*pauVar2 + 0x18);
          auVar78 = *(undefined1 (*) [28])*pauVar2;
          auVar121._0_4_ = fVar108 * auVar166._0_4_;
          auVar121._4_4_ = fVar122 * auVar166._4_4_;
          auVar121._8_4_ = fVar172 * auVar166._8_4_;
          auVar121._12_4_ = fVar173 * auVar166._12_4_;
          auVar121._16_4_ = fVar174 * auVar166._16_4_;
          auVar121._20_4_ = fVar181 * auVar166._20_4_;
          auVar121._28_36_ = auVar193._28_36_;
          auVar121._24_4_ = fVar182 * auVar166._24_4_;
          auVar180._0_4_ = fVar108 * fVar123;
          auVar180._4_4_ = fVar122 * fVar102;
          auVar180._8_4_ = fVar172 * fVar103;
          auVar180._12_4_ = fVar173 * fVar104;
          auVar180._16_4_ = fVar174 * fVar105;
          auVar180._20_4_ = fVar181 * fVar106;
          auVar180._28_36_ = auVar157._28_36_;
          auVar180._24_4_ = fVar182 * fVar107;
          auVar143 = vfmadd231ps_fma(auVar121._0_32_,auVar137,auVar190._0_32_);
          auVar159 = auVar163._0_32_;
          auVar11 = vfmadd231ps_fma(auVar180._0_32_,auVar137,auVar159);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar148,auVar171._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar148,local_2a0);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar112,auVar138._0_32_);
          auVar193 = ZEXT1664(auVar143);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar112,local_3e0);
          local_720 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 * 4 + lVar20);
          auVar100 = *(undefined1 (*) [32])(lVar20 + 0x21b13cc + lVar85 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar20 + 0x21b1850 + lVar85 * 4);
          pfVar3 = (float *)(lVar20 + 0x21b1cd4 + lVar85 * 4);
          fVar194 = *pfVar3;
          fVar195 = pfVar3[1];
          fVar196 = pfVar3[2];
          fVar197 = pfVar3[3];
          fVar72 = pfVar3[4];
          fVar73 = pfVar3[5];
          fVar74 = pfVar3[6];
          auVar202._0_4_ = fVar194 * auVar166._0_4_;
          auVar202._4_4_ = fVar195 * auVar166._4_4_;
          auVar202._8_4_ = fVar196 * auVar166._8_4_;
          auVar202._12_4_ = fVar197 * auVar166._12_4_;
          auVar202._16_4_ = fVar72 * auVar166._16_4_;
          auVar202._20_4_ = fVar73 * auVar166._20_4_;
          auVar202._28_36_ = auVar166._28_36_;
          auVar202._24_4_ = fVar74 * auVar166._24_4_;
          auVar157._0_4_ = fVar123 * fVar194;
          auVar157._4_4_ = fVar102 * fVar195;
          auVar157._8_4_ = fVar103 * fVar196;
          auVar157._12_4_ = fVar104 * fVar197;
          auVar157._16_4_ = fVar105 * fVar72;
          auVar157._20_4_ = fVar106 * fVar73;
          auVar157._28_36_ = auVar190._28_36_;
          auVar157._24_4_ = fVar107 * fVar74;
          auVar12 = vfmadd231ps_fma(auVar202._0_32_,auVar118,auVar190._0_32_);
          auVar13 = vfmadd231ps_fma(auVar157._0_32_,auVar118,auVar159);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar100,auVar171._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar100,local_2a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_720,auVar138._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_720,local_3e0);
          local_440 = ZEXT1632(auVar12);
          local_2c0 = ZEXT1632(auVar143);
          auVar95 = vsubps_avx(local_440,local_2c0);
          local_4c0 = ZEXT1632(auVar11);
          local_340 = ZEXT1632(auVar13);
          auVar16 = vsubps_avx(local_340,local_4c0);
          auVar71._4_4_ = auVar95._4_4_ * auVar11._4_4_;
          auVar71._0_4_ = auVar95._0_4_ * auVar11._0_4_;
          auVar71._8_4_ = auVar95._8_4_ * auVar11._8_4_;
          auVar71._12_4_ = auVar95._12_4_ * auVar11._12_4_;
          auVar71._16_4_ = auVar95._16_4_ * 0.0;
          auVar71._20_4_ = auVar95._20_4_ * 0.0;
          auVar71._24_4_ = auVar95._24_4_ * 0.0;
          auVar71._28_4_ = local_3e0._28_4_;
          auVar157 = ZEXT3264(auVar137);
          fVar123 = auVar16._0_4_;
          fVar102 = auVar16._4_4_;
          auVar41._4_4_ = auVar143._4_4_ * fVar102;
          auVar41._0_4_ = auVar143._0_4_ * fVar123;
          fVar103 = auVar16._8_4_;
          auVar41._8_4_ = auVar143._8_4_ * fVar103;
          fVar104 = auVar16._12_4_;
          auVar41._12_4_ = auVar143._12_4_ * fVar104;
          fVar105 = auVar16._16_4_;
          auVar41._16_4_ = fVar105 * 0.0;
          fVar106 = auVar16._20_4_;
          auVar41._20_4_ = fVar106 * 0.0;
          fVar107 = auVar16._24_4_;
          auVar41._24_4_ = fVar107 * 0.0;
          auVar41._28_4_ = local_2a0._28_4_;
          auVar19 = vsubps_avx(auVar71,auVar41);
          _local_2e0 = *pauVar2;
          auVar17 = _local_2e0;
          auVar185._0_4_ = fVar108 * (float)local_e0;
          auVar185._4_4_ = fVar122 * local_e0._4_4_;
          auVar185._8_4_ = fVar172 * (float)uStack_d8;
          auVar185._12_4_ = fVar173 * uStack_d8._4_4_;
          auVar185._16_4_ = fVar174 * (float)uStack_d0;
          auVar185._20_4_ = fVar181 * uStack_d0._4_4_;
          auVar185._28_36_ = auVar163._28_36_;
          auVar185._24_4_ = fVar182 * (float)uStack_c8;
          auVar143 = vfmadd231ps_fma(auVar185._0_32_,auVar137,local_c0);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_a0,auVar148);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_80,auVar112);
          auVar42._4_4_ = fVar195 * local_e0._4_4_;
          auVar42._0_4_ = fVar194 * (float)local_e0;
          auVar42._8_4_ = fVar196 * (float)uStack_d8;
          auVar42._12_4_ = fVar197 * uStack_d8._4_4_;
          auVar42._16_4_ = fVar72 * (float)uStack_d0;
          auVar42._20_4_ = fVar73 * uStack_d0._4_4_;
          auVar42._24_4_ = fVar74 * (float)uStack_c8;
          auVar42._28_4_ = uStack_c8._4_4_;
          auVar12 = vfmadd231ps_fma(auVar42,auVar118,local_c0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar100,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_720,local_80);
          auVar43._4_4_ = fVar102 * fVar102;
          auVar43._0_4_ = fVar123 * fVar123;
          auVar43._8_4_ = fVar103 * fVar103;
          auVar43._12_4_ = fVar104 * fVar104;
          auVar43._16_4_ = fVar105 * fVar105;
          auVar43._20_4_ = fVar106 * fVar106;
          auVar43._24_4_ = fVar107 * fVar107;
          auVar43._28_4_ = local_80._28_4_;
          auVar13 = vfmadd231ps_fma(auVar43,auVar95,auVar95);
          auVar132 = vmaxps_avx(ZEXT1632(auVar143),ZEXT1632(auVar12));
          auVar177._0_4_ = auVar132._0_4_ * auVar132._0_4_ * auVar13._0_4_;
          auVar177._4_4_ = auVar132._4_4_ * auVar132._4_4_ * auVar13._4_4_;
          auVar177._8_4_ = auVar132._8_4_ * auVar132._8_4_ * auVar13._8_4_;
          auVar177._12_4_ = auVar132._12_4_ * auVar132._12_4_ * auVar13._12_4_;
          auVar177._16_4_ = auVar132._16_4_ * auVar132._16_4_ * 0.0;
          auVar177._20_4_ = auVar132._20_4_ * auVar132._20_4_ * 0.0;
          auVar177._24_4_ = auVar132._24_4_ * auVar132._24_4_ * 0.0;
          auVar177._28_4_ = 0;
          auVar44._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar44._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar44._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar44._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar44._16_4_ = auVar19._16_4_ * auVar19._16_4_;
          auVar44._20_4_ = auVar19._20_4_ * auVar19._20_4_;
          auVar44._24_4_ = auVar19._24_4_ * auVar19._24_4_;
          auVar44._28_4_ = auVar19._28_4_;
          auVar132 = vcmpps_avx(auVar44,auVar177,2);
          local_1e0 = (int)lVar85;
          auVar178._4_4_ = local_1e0;
          auVar178._0_4_ = local_1e0;
          auVar178._8_4_ = local_1e0;
          auVar178._12_4_ = local_1e0;
          auVar178._16_4_ = local_1e0;
          auVar178._20_4_ = local_1e0;
          auVar178._24_4_ = local_1e0;
          auVar178._28_4_ = local_1e0;
          auVar19 = vpor_avx2(auVar178,_DAT_01fe9900);
          auVar101 = vpcmpgtd_avx2(local_300,auVar19);
          auVar19 = auVar101 & auVar132;
          fVar123 = (float)local_580;
          fVar102 = local_580._4_4_;
          fVar103 = (float)uStack_578;
          fVar104 = uStack_578._4_4_;
          fVar105 = (float)uStack_570;
          fVar106 = uStack_570._4_4_;
          fVar107 = (float)uStack_568;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
            auVar185 = ZEXT3264(auVar96);
LAB_015c3334:
            auVar190 = ZEXT3264(local_680);
            auVar180 = ZEXT3264(local_6c0);
            auVar163 = ZEXT3264(auVar159);
            auVar121 = ZEXT3264(local_6e0);
            auVar166 = ZEXT3264(CONCAT428(fStack_604,
                                          CONCAT424(fStack_608,
                                                    CONCAT420(fStack_60c,
                                                              CONCAT416(fStack_610,
                                                                        CONCAT412(fStack_614,
                                                                                  CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
            auVar171 = ZEXT3264(local_640);
          }
          else {
            local_320 = vandps_avx(auVar101,auVar132);
            auVar45._4_4_ = fVar195 * local_4a0._4_4_;
            auVar45._0_4_ = fVar194 * (float)local_4a0;
            auVar45._8_4_ = fVar196 * (float)uStack_498;
            auVar45._12_4_ = fVar197 * uStack_498._4_4_;
            auVar45._16_4_ = fVar72 * (float)uStack_490;
            auVar45._20_4_ = fVar73 * uStack_490._4_4_;
            auVar45._24_4_ = fVar74 * (float)uStack_488;
            auVar45._28_4_ = auVar132._28_4_;
            auVar13 = vfmadd213ps_fma(auVar118,local_3c0,auVar45);
            auVar13 = vfmadd213ps_fma(auVar100,local_280,ZEXT1632(auVar13));
            auVar13 = vfmadd132ps_fma(local_720,ZEXT1632(auVar13),local_400);
            local_2e0._0_4_ = auVar78._0_4_;
            local_2e0._4_4_ = auVar78._4_4_;
            fStack_2d8 = auVar78._8_4_;
            fStack_2d4 = auVar78._12_4_;
            fStack_2d0 = auVar78._16_4_;
            fStack_2cc = auVar78._20_4_;
            fStack_2c8 = auVar78._24_4_;
            auVar46._4_4_ = local_4a0._4_4_ * (float)local_2e0._4_4_;
            auVar46._0_4_ = (float)local_4a0 * (float)local_2e0._0_4_;
            auVar46._8_4_ = (float)uStack_498 * fStack_2d8;
            auVar46._12_4_ = uStack_498._4_4_ * fStack_2d4;
            auVar46._16_4_ = (float)uStack_490 * fStack_2d0;
            auVar46._20_4_ = uStack_490._4_4_ * fStack_2cc;
            auVar46._24_4_ = (float)uStack_488 * fStack_2c8;
            auVar46._28_4_ = auVar132._28_4_;
            auVar14 = vfmadd213ps_fma(auVar137,local_3c0,auVar46);
            auVar14 = vfmadd213ps_fma(auVar148,local_280,ZEXT1632(auVar14));
            auVar148 = *(undefined1 (*) [32])(lVar20 + 0x21afd38 + lVar85 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar20 + 0x21b01bc + lVar85 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar20 + 0x21b0640 + lVar85 * 4);
            pfVar3 = (float *)(lVar20 + 0x21b0ac4 + lVar85 * 4);
            fVar108 = *pfVar3;
            fVar122 = pfVar3[1];
            fVar172 = pfVar3[2];
            fVar173 = pfVar3[3];
            fVar174 = pfVar3[4];
            fVar181 = pfVar3[5];
            fVar182 = pfVar3[6];
            auVar47._4_4_ = fStack_61c * fVar122;
            auVar47._0_4_ = local_620 * fVar108;
            auVar47._8_4_ = fStack_618 * fVar172;
            auVar47._12_4_ = fStack_614 * fVar173;
            auVar47._16_4_ = fStack_610 * fVar174;
            auVar47._20_4_ = fStack_60c * fVar181;
            auVar47._24_4_ = fStack_608 * fVar182;
            auVar47._28_4_ = auVar95._28_4_;
            auVar191._0_4_ = (float)local_580 * fVar108;
            auVar191._4_4_ = local_580._4_4_ * fVar122;
            auVar191._8_4_ = (float)uStack_578 * fVar172;
            auVar191._12_4_ = uStack_578._4_4_ * fVar173;
            auVar191._16_4_ = (float)uStack_570 * fVar174;
            auVar191._20_4_ = uStack_570._4_4_ * fVar181;
            auVar191._24_4_ = (float)uStack_568 * fVar182;
            auVar191._28_4_ = 0;
            auVar48._4_4_ = fVar122 * local_4a0._4_4_;
            auVar48._0_4_ = fVar108 * (float)local_4a0;
            auVar48._8_4_ = fVar172 * (float)uStack_498;
            auVar48._12_4_ = fVar173 * uStack_498._4_4_;
            auVar48._16_4_ = fVar174 * (float)uStack_490;
            auVar48._20_4_ = fVar181 * uStack_490._4_4_;
            auVar48._24_4_ = fVar182 * (float)uStack_488;
            auVar48._28_4_ = pfVar3[7];
            auVar15 = vfmadd231ps_fma(auVar47,auVar100,local_680);
            auVar93 = vfmadd231ps_fma(auVar191,auVar100,auVar159);
            auVar92 = vfmadd231ps_fma(auVar48,local_3c0,auVar100);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar137,local_640);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar137,local_2a0);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_280,auVar137);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar148,local_5c0);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar148,local_3e0);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar148,local_400);
            pfVar3 = (float *)(lVar20 + 0x21b2ee4 + lVar85 * 4);
            fVar108 = *pfVar3;
            fVar122 = pfVar3[1];
            fVar172 = pfVar3[2];
            fVar173 = pfVar3[3];
            fVar174 = pfVar3[4];
            fVar181 = pfVar3[5];
            fVar182 = pfVar3[6];
            auVar49._4_4_ = fStack_61c * fVar122;
            auVar49._0_4_ = local_620 * fVar108;
            auVar49._8_4_ = fStack_618 * fVar172;
            auVar49._12_4_ = fStack_614 * fVar173;
            auVar49._16_4_ = fStack_610 * fVar174;
            auVar49._20_4_ = fStack_60c * fVar181;
            auVar49._24_4_ = fStack_608 * fVar182;
            auVar49._28_4_ = fStack_604;
            auVar50._4_4_ = local_580._4_4_ * fVar122;
            auVar50._0_4_ = (float)local_580 * fVar108;
            auVar50._8_4_ = (float)uStack_578 * fVar172;
            auVar50._12_4_ = uStack_578._4_4_ * fVar173;
            auVar50._16_4_ = (float)uStack_570 * fVar174;
            auVar50._20_4_ = uStack_570._4_4_ * fVar181;
            auVar50._24_4_ = (float)uStack_568 * fVar182;
            auVar50._28_4_ = uStack_568._4_4_;
            auVar51._4_4_ = fVar122 * local_4a0._4_4_;
            auVar51._0_4_ = fVar108 * (float)local_4a0;
            auVar51._8_4_ = fVar172 * (float)uStack_498;
            auVar51._12_4_ = fVar173 * uStack_498._4_4_;
            auVar51._16_4_ = fVar174 * (float)uStack_490;
            auVar51._20_4_ = fVar181 * uStack_490._4_4_;
            auVar51._24_4_ = fVar182 * (float)uStack_488;
            auVar51._28_4_ = pfVar3[7];
            auVar148 = *(undefined1 (*) [32])(lVar20 + 0x21b2a60 + lVar85 * 4);
            auVar124 = vfmadd231ps_fma(auVar49,auVar148,local_680);
            auVar110 = vfmadd231ps_fma(auVar50,auVar148,auVar159);
            auVar91 = vfmadd231ps_fma(auVar51,local_3c0,auVar148);
            auVar148 = *(undefined1 (*) [32])(lVar20 + 0x21b25dc + lVar85 * 4);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar148,local_640);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar148,local_2a0);
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_280,auVar148);
            auVar148 = *(undefined1 (*) [32])(lVar20 + 0x21b2158 + lVar85 * 4);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar148,local_5c0);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar148,local_3e0);
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_400,auVar148);
            auVar179._8_4_ = 0x7fffffff;
            auVar179._0_8_ = 0x7fffffff7fffffff;
            auVar179._12_4_ = 0x7fffffff;
            auVar179._16_4_ = 0x7fffffff;
            auVar179._20_4_ = 0x7fffffff;
            auVar179._24_4_ = 0x7fffffff;
            auVar179._28_4_ = 0x7fffffff;
            auVar148 = vandps_avx(ZEXT1632(auVar15),auVar179);
            auVar137 = vandps_avx(ZEXT1632(auVar93),auVar179);
            auVar137 = vmaxps_avx(auVar148,auVar137);
            auVar148 = vandps_avx(ZEXT1632(auVar92),auVar179);
            auVar148 = vmaxps_avx(auVar137,auVar148);
            auVar148 = vcmpps_avx(auVar148,local_360,1);
            auVar100 = vblendvps_avx(ZEXT1632(auVar15),auVar95,auVar148);
            auVar118 = vblendvps_avx(ZEXT1632(auVar93),auVar16,auVar148);
            auVar148 = vandps_avx(ZEXT1632(auVar124),auVar179);
            auVar137 = vandps_avx(ZEXT1632(auVar110),auVar179);
            auVar137 = vmaxps_avx(auVar148,auVar137);
            auVar148 = vandps_avx(auVar179,ZEXT1632(auVar91));
            auVar148 = vmaxps_avx(auVar137,auVar148);
            auVar137 = vcmpps_avx(auVar148,local_360,1);
            auVar148 = vblendvps_avx(ZEXT1632(auVar124),auVar95,auVar137);
            auVar137 = vblendvps_avx(ZEXT1632(auVar110),auVar16,auVar137);
            auVar14 = vfmadd213ps_fma(auVar112,local_400,ZEXT1632(auVar14));
            auVar15 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar118,auVar118);
            auVar112 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar108 = auVar112._0_4_;
            fVar122 = auVar112._4_4_;
            fVar172 = auVar112._8_4_;
            fVar173 = auVar112._12_4_;
            fVar174 = auVar112._16_4_;
            fVar181 = auVar112._20_4_;
            fVar182 = auVar112._24_4_;
            auVar52._4_4_ = fVar122 * fVar122 * fVar122 * auVar15._4_4_ * -0.5;
            auVar52._0_4_ = fVar108 * fVar108 * fVar108 * auVar15._0_4_ * -0.5;
            auVar52._8_4_ = fVar172 * fVar172 * fVar172 * auVar15._8_4_ * -0.5;
            auVar52._12_4_ = fVar173 * fVar173 * fVar173 * auVar15._12_4_ * -0.5;
            auVar52._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar52._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar52._24_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar52._28_4_ = 0;
            auVar201._8_4_ = 0x3fc00000;
            auVar201._0_8_ = 0x3fc000003fc00000;
            auVar201._12_4_ = 0x3fc00000;
            auVar201._16_4_ = 0x3fc00000;
            auVar201._20_4_ = 0x3fc00000;
            auVar201._24_4_ = 0x3fc00000;
            auVar201._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar52,auVar201,auVar112);
            fVar108 = auVar15._0_4_;
            fVar122 = auVar15._4_4_;
            auVar53._4_4_ = auVar118._4_4_ * fVar122;
            auVar53._0_4_ = auVar118._0_4_ * fVar108;
            fVar172 = auVar15._8_4_;
            auVar53._8_4_ = auVar118._8_4_ * fVar172;
            fVar173 = auVar15._12_4_;
            auVar53._12_4_ = auVar118._12_4_ * fVar173;
            auVar53._16_4_ = auVar118._16_4_ * 0.0;
            auVar53._20_4_ = auVar118._20_4_ * 0.0;
            auVar53._24_4_ = auVar118._24_4_ * 0.0;
            auVar53._28_4_ = auVar112._28_4_;
            auVar54._4_4_ = fVar122 * -auVar100._4_4_;
            auVar54._0_4_ = fVar108 * -auVar100._0_4_;
            auVar54._8_4_ = fVar172 * -auVar100._8_4_;
            auVar54._12_4_ = fVar173 * -auVar100._12_4_;
            auVar54._16_4_ = -auVar100._16_4_ * 0.0;
            auVar54._20_4_ = -auVar100._20_4_ * 0.0;
            auVar54._24_4_ = -auVar100._24_4_ * 0.0;
            auVar54._28_4_ = auVar118._28_4_;
            auVar15 = vfmadd213ps_fma(auVar148,auVar148,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar137,auVar137);
            auVar112 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar55._28_4_ = auVar95._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar173 * 0.0,
                                    CONCAT48(fVar172 * 0.0,CONCAT44(fVar122 * 0.0,fVar108 * 0.0))));
            fVar108 = auVar112._0_4_;
            fVar122 = auVar112._4_4_;
            fVar172 = auVar112._8_4_;
            fVar173 = auVar112._12_4_;
            fVar174 = auVar112._16_4_;
            fVar181 = auVar112._20_4_;
            fVar182 = auVar112._24_4_;
            auVar56._4_4_ = fVar122 * fVar122 * fVar122 * auVar15._4_4_ * -0.5;
            auVar56._0_4_ = fVar108 * fVar108 * fVar108 * auVar15._0_4_ * -0.5;
            auVar56._8_4_ = fVar172 * fVar172 * fVar172 * auVar15._8_4_ * -0.5;
            auVar56._12_4_ = fVar173 * fVar173 * fVar173 * auVar15._12_4_ * -0.5;
            auVar56._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar56._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar56._24_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar56._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar56,auVar201,auVar112);
            fVar108 = auVar15._0_4_;
            fVar122 = auVar15._4_4_;
            auVar57._4_4_ = auVar137._4_4_ * fVar122;
            auVar57._0_4_ = auVar137._0_4_ * fVar108;
            fVar172 = auVar15._8_4_;
            auVar57._8_4_ = auVar137._8_4_ * fVar172;
            fVar173 = auVar15._12_4_;
            auVar57._12_4_ = auVar137._12_4_ * fVar173;
            auVar57._16_4_ = auVar137._16_4_ * 0.0;
            auVar57._20_4_ = auVar137._20_4_ * 0.0;
            auVar57._24_4_ = auVar137._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar122 * -auVar148._4_4_;
            auVar58._0_4_ = fVar108 * -auVar148._0_4_;
            auVar58._8_4_ = fVar172 * -auVar148._8_4_;
            auVar58._12_4_ = fVar173 * -auVar148._12_4_;
            auVar58._16_4_ = -auVar148._16_4_ * 0.0;
            auVar58._20_4_ = -auVar148._20_4_ * 0.0;
            auVar58._24_4_ = -auVar148._24_4_ * 0.0;
            auVar58._28_4_ = auVar112._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar173 * 0.0,
                                    CONCAT48(fVar172 * 0.0,CONCAT44(fVar122 * 0.0,fVar108 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar143),local_2c0);
            auVar112 = ZEXT1632(auVar143);
            auVar93 = vfmadd213ps_fma(auVar54,auVar112,local_4c0);
            auVar92 = vfmadd213ps_fma(auVar55,auVar112,ZEXT1632(auVar14));
            auVar111 = vfnmadd213ps_fma(auVar53,auVar112,local_2c0);
            auVar124 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar12),local_440);
            auVar134 = vfnmadd213ps_fma(auVar54,auVar112,local_4c0);
            auVar112 = ZEXT1632(auVar12);
            auVar110 = vfmadd213ps_fma(auVar58,auVar112,local_340);
            auVar160 = ZEXT1632(auVar143);
            auVar109 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar160,auVar55);
            auVar14 = vfmadd213ps_fma(auVar59,auVar112,ZEXT1632(auVar13));
            auVar140 = vfnmadd213ps_fma(auVar57,auVar112,local_440);
            auVar90 = vfnmadd213ps_fma(auVar58,auVar112,local_340);
            auVar139 = vfnmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar12),auVar59);
            auVar112 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar134));
            auVar148 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar109));
            auVar161._0_4_ = auVar112._0_4_ * auVar109._0_4_;
            auVar161._4_4_ = auVar112._4_4_ * auVar109._4_4_;
            auVar161._8_4_ = auVar112._8_4_ * auVar109._8_4_;
            auVar161._12_4_ = auVar112._12_4_ * auVar109._12_4_;
            auVar161._16_4_ = auVar112._16_4_ * 0.0;
            auVar161._20_4_ = auVar112._20_4_ * 0.0;
            auVar161._24_4_ = auVar112._24_4_ * 0.0;
            auVar161._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar161,ZEXT1632(auVar134),auVar148);
            auVar60._4_4_ = auVar111._4_4_ * auVar148._4_4_;
            auVar60._0_4_ = auVar111._0_4_ * auVar148._0_4_;
            auVar60._8_4_ = auVar111._8_4_ * auVar148._8_4_;
            auVar60._12_4_ = auVar111._12_4_ * auVar148._12_4_;
            auVar60._16_4_ = auVar148._16_4_ * 0.0;
            auVar60._20_4_ = auVar148._20_4_ * 0.0;
            auVar60._24_4_ = auVar148._24_4_ * 0.0;
            auVar60._28_4_ = auVar148._28_4_;
            auVar95 = ZEXT1632(auVar111);
            auVar148 = vsubps_avx(ZEXT1632(auVar124),auVar95);
            auVar101 = ZEXT1632(auVar109);
            auVar13 = vfmsub231ps_fma(auVar60,auVar101,auVar148);
            auVar61._4_4_ = auVar134._4_4_ * auVar148._4_4_;
            auVar61._0_4_ = auVar134._0_4_ * auVar148._0_4_;
            auVar61._8_4_ = auVar134._8_4_ * auVar148._8_4_;
            auVar61._12_4_ = auVar134._12_4_ * auVar148._12_4_;
            auVar61._16_4_ = auVar148._16_4_ * 0.0;
            auVar61._20_4_ = auVar148._20_4_ * 0.0;
            auVar61._24_4_ = auVar148._24_4_ * 0.0;
            auVar61._28_4_ = auVar148._28_4_;
            auVar111 = vfmsub231ps_fma(auVar61,auVar95,auVar112);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar91));
            auVar159 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,2);
            auVar112 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar15),auVar159);
            auVar148 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar93),auVar159);
            auVar137 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar92),auVar159);
            auVar100 = vblendvps_avx(auVar95,ZEXT1632(auVar124),auVar159);
            auVar118 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar110),auVar159);
            auVar132 = vblendvps_avx(auVar101,ZEXT1632(auVar14),auVar159);
            auVar95 = vblendvps_avx(ZEXT1632(auVar124),auVar95,auVar159);
            auVar19 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar134),auVar159);
            auVar13 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
            local_720 = ZEXT1632(auVar13);
            auVar101 = vblendvps_avx(ZEXT1632(auVar14),auVar101,auVar159);
            auVar95 = vsubps_avx(auVar95,auVar112);
            auVar19 = vsubps_avx(auVar19,auVar148);
            auVar113 = vsubps_avx(auVar101,auVar137);
            auVar114 = vsubps_avx(auVar112,auVar100);
            auVar18 = vsubps_avx(auVar148,auVar118);
            auVar200 = vsubps_avx(auVar137,auVar132);
            auVar154._0_4_ = auVar113._0_4_ * auVar112._0_4_;
            auVar154._4_4_ = auVar113._4_4_ * auVar112._4_4_;
            auVar154._8_4_ = auVar113._8_4_ * auVar112._8_4_;
            auVar154._12_4_ = auVar113._12_4_ * auVar112._12_4_;
            auVar154._16_4_ = auVar113._16_4_ * auVar112._16_4_;
            auVar154._20_4_ = auVar113._20_4_ * auVar112._20_4_;
            auVar154._24_4_ = auVar113._24_4_ * auVar112._24_4_;
            auVar154._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar154,auVar137,auVar95);
            auVar62._4_4_ = auVar95._4_4_ * auVar148._4_4_;
            auVar62._0_4_ = auVar95._0_4_ * auVar148._0_4_;
            auVar62._8_4_ = auVar95._8_4_ * auVar148._8_4_;
            auVar62._12_4_ = auVar95._12_4_ * auVar148._12_4_;
            auVar62._16_4_ = auVar95._16_4_ * auVar148._16_4_;
            auVar62._20_4_ = auVar95._20_4_ * auVar148._20_4_;
            auVar62._24_4_ = auVar95._24_4_ * auVar148._24_4_;
            auVar62._28_4_ = auVar101._28_4_;
            auVar15 = vfmsub231ps_fma(auVar62,auVar112,auVar19);
            auVar193 = ZEXT864(0) << 0x20;
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar155._0_4_ = auVar19._0_4_ * auVar137._0_4_;
            auVar155._4_4_ = auVar19._4_4_ * auVar137._4_4_;
            auVar155._8_4_ = auVar19._8_4_ * auVar137._8_4_;
            auVar155._12_4_ = auVar19._12_4_ * auVar137._12_4_;
            auVar155._16_4_ = auVar19._16_4_ * auVar137._16_4_;
            auVar155._20_4_ = auVar19._20_4_ * auVar137._20_4_;
            auVar155._24_4_ = auVar19._24_4_ * auVar137._24_4_;
            auVar155._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar155,auVar148,auVar113);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar156._0_4_ = auVar200._0_4_ * auVar100._0_4_;
            auVar156._4_4_ = auVar200._4_4_ * auVar100._4_4_;
            auVar156._8_4_ = auVar200._8_4_ * auVar100._8_4_;
            auVar156._12_4_ = auVar200._12_4_ * auVar100._12_4_;
            auVar156._16_4_ = auVar200._16_4_ * auVar100._16_4_;
            auVar156._20_4_ = auVar200._20_4_ * auVar100._20_4_;
            auVar156._24_4_ = auVar200._24_4_ * auVar100._24_4_;
            auVar156._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar156,auVar114,auVar132);
            auVar63._4_4_ = auVar18._4_4_ * auVar132._4_4_;
            auVar63._0_4_ = auVar18._0_4_ * auVar132._0_4_;
            auVar63._8_4_ = auVar18._8_4_ * auVar132._8_4_;
            auVar63._12_4_ = auVar18._12_4_ * auVar132._12_4_;
            auVar63._16_4_ = auVar18._16_4_ * auVar132._16_4_;
            auVar63._20_4_ = auVar18._20_4_ * auVar132._20_4_;
            auVar63._24_4_ = auVar18._24_4_ * auVar132._24_4_;
            auVar63._28_4_ = auVar132._28_4_;
            auVar93 = vfmsub231ps_fma(auVar63,auVar118,auVar200);
            auVar64._4_4_ = auVar114._4_4_ * auVar118._4_4_;
            auVar64._0_4_ = auVar114._0_4_ * auVar118._0_4_;
            auVar64._8_4_ = auVar114._8_4_ * auVar118._8_4_;
            auVar64._12_4_ = auVar114._12_4_ * auVar118._12_4_;
            auVar64._16_4_ = auVar114._16_4_ * auVar118._16_4_;
            auVar64._20_4_ = auVar114._20_4_ * auVar118._20_4_;
            auVar64._24_4_ = auVar114._24_4_ * auVar118._24_4_;
            auVar64._28_4_ = auVar118._28_4_;
            auVar92 = vfmsub231ps_fma(auVar64,auVar18,auVar100);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar93));
            auVar100 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar93));
            auVar100 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,2);
            auVar14 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            auVar14 = vpand_avx(auVar14,auVar13);
            auVar100 = vpmovsxwd_avx2(auVar14);
            auVar157 = ZEXT3264(auVar100);
            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0x7f,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar100 >> 0xbf,0) == '\0') &&
                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar100[0x1f]) {
LAB_015c37e8:
              auVar202 = ZEXT3264(CONCAT824(uStack_448,
                                            CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
              auVar185 = ZEXT3264(auVar96);
            }
            else {
              auVar65._4_4_ = auVar19._4_4_ * auVar200._4_4_;
              auVar65._0_4_ = auVar19._0_4_ * auVar200._0_4_;
              auVar65._8_4_ = auVar19._8_4_ * auVar200._8_4_;
              auVar65._12_4_ = auVar19._12_4_ * auVar200._12_4_;
              auVar65._16_4_ = auVar19._16_4_ * auVar200._16_4_;
              auVar65._20_4_ = auVar19._20_4_ * auVar200._20_4_;
              auVar65._24_4_ = auVar19._24_4_ * auVar200._24_4_;
              auVar65._28_4_ = auVar100._28_4_;
              auVar91 = vfmsub231ps_fma(auVar65,auVar18,auVar113);
              auVar162._0_4_ = auVar114._0_4_ * auVar113._0_4_;
              auVar162._4_4_ = auVar114._4_4_ * auVar113._4_4_;
              auVar162._8_4_ = auVar114._8_4_ * auVar113._8_4_;
              auVar162._12_4_ = auVar114._12_4_ * auVar113._12_4_;
              auVar162._16_4_ = auVar114._16_4_ * auVar113._16_4_;
              auVar162._20_4_ = auVar114._20_4_ * auVar113._20_4_;
              auVar162._24_4_ = auVar114._24_4_ * auVar113._24_4_;
              auVar162._28_4_ = 0;
              auVar110 = vfmsub231ps_fma(auVar162,auVar95,auVar200);
              auVar66._4_4_ = auVar95._4_4_ * auVar18._4_4_;
              auVar66._0_4_ = auVar95._0_4_ * auVar18._0_4_;
              auVar66._8_4_ = auVar95._8_4_ * auVar18._8_4_;
              auVar66._12_4_ = auVar95._12_4_ * auVar18._12_4_;
              auVar66._16_4_ = auVar95._16_4_ * auVar18._16_4_;
              auVar66._20_4_ = auVar95._20_4_ * auVar18._20_4_;
              auVar66._24_4_ = auVar95._24_4_ * auVar18._24_4_;
              auVar66._28_4_ = auVar18._28_4_;
              auVar111 = vfmsub231ps_fma(auVar66,auVar114,auVar19);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar110),ZEXT1632(auVar111));
              auVar124 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar91),ZEXT832(0) << 0x20);
              auVar100 = vrcpps_avx(ZEXT1632(auVar124));
              auVar192._8_4_ = 0x3f800000;
              auVar192._0_8_ = 0x3f8000003f800000;
              auVar192._12_4_ = 0x3f800000;
              auVar192._16_4_ = 0x3f800000;
              auVar192._20_4_ = 0x3f800000;
              auVar192._24_4_ = 0x3f800000;
              auVar192._28_4_ = 0x3f800000;
              auVar193 = ZEXT3264(auVar192);
              auVar92 = vfnmadd213ps_fma(auVar100,ZEXT1632(auVar124),auVar192);
              auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar100,auVar100);
              auVar67._4_4_ = auVar111._4_4_ * auVar137._4_4_;
              auVar67._0_4_ = auVar111._0_4_ * auVar137._0_4_;
              auVar67._8_4_ = auVar111._8_4_ * auVar137._8_4_;
              auVar67._12_4_ = auVar111._12_4_ * auVar137._12_4_;
              auVar67._16_4_ = auVar137._16_4_ * 0.0;
              auVar67._20_4_ = auVar137._20_4_ * 0.0;
              auVar67._24_4_ = auVar137._24_4_ * 0.0;
              auVar67._28_4_ = auVar137._28_4_;
              auVar110 = vfmadd231ps_fma(auVar67,ZEXT1632(auVar110),auVar148);
              auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar91),auVar112);
              fVar122 = auVar92._0_4_;
              fVar172 = auVar92._4_4_;
              fVar173 = auVar92._8_4_;
              fVar174 = auVar92._12_4_;
              auVar118 = ZEXT1632(CONCAT412(fVar174 * auVar110._12_4_,
                                            CONCAT48(fVar173 * auVar110._8_4_,
                                                     CONCAT44(fVar172 * auVar110._4_4_,
                                                              fVar122 * auVar110._0_4_))));
              auVar157 = ZEXT3264(auVar118);
              fVar108 = ray->tfar;
              auVar136._4_4_ = fVar108;
              auVar136._0_4_ = fVar108;
              auVar136._8_4_ = fVar108;
              auVar136._12_4_ = fVar108;
              auVar136._16_4_ = fVar108;
              auVar136._20_4_ = fVar108;
              auVar136._24_4_ = fVar108;
              auVar136._28_4_ = fVar108;
              auVar77._8_8_ = uStack_f8;
              auVar77._0_8_ = local_100;
              auVar77._16_8_ = uStack_f0;
              auVar77._24_8_ = uStack_e8;
              auVar137 = vcmpps_avx(auVar77,auVar118,2);
              auVar100 = vcmpps_avx(auVar118,auVar136,2);
              auVar137 = vandps_avx(auVar100,auVar137);
              auVar92 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
              auVar14 = vpand_avx(auVar14,auVar92);
              auVar137 = vpmovsxwd_avx2(auVar14);
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar137 >> 0x7f,0) == '\0') &&
                    (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0xbf,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar137[0x1f]) goto LAB_015c37e8;
              auVar137 = vcmpps_avx(ZEXT1632(auVar124),ZEXT832(0) << 0x20,4);
              auVar92 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
              auVar14 = vpand_avx(auVar14,auVar92);
              auVar137 = vpmovsxwd_avx2(auVar14);
              auVar202 = ZEXT3264(CONCAT824(uStack_448,
                                            CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
              auVar185 = ZEXT3264(auVar96);
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0x7f,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar137 >> 0xbf,0) != '\0') ||
                  (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar137[0x1f] < '\0') {
                auVar132 = ZEXT1632(CONCAT412(fVar174 * auVar15._12_4_,
                                              CONCAT48(fVar173 * auVar15._8_4_,
                                                       CONCAT44(fVar172 * auVar15._4_4_,
                                                                fVar122 * auVar15._0_4_))));
                auVar68._28_4_ = SUB84(uStack_448,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar174 * auVar93._12_4_,
                                        CONCAT48(fVar173 * auVar93._8_4_,
                                                 CONCAT44(fVar172 * auVar93._4_4_,
                                                          fVar122 * auVar93._0_4_))));
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar100 = vsubps_avx(auVar170,auVar132);
                local_6e0 = vblendvps_avx(auVar100,auVar132,auVar159);
                auVar100 = vsubps_avx(auVar170,auVar68);
                local_3a0 = vblendvps_avx(auVar100,auVar68,auVar159);
                auVar202 = ZEXT3264(auVar137);
                auVar185 = ZEXT3264(auVar118);
              }
            }
            auVar190 = ZEXT3264(local_680);
            auVar180 = ZEXT3264(local_6c0);
            auVar137 = auVar202._0_32_;
            auVar159 = local_5a0;
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0x7f,0) == '\0') &&
                  (auVar202 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar137 >> 0xbf,0) == '\0') &&
                (auVar202 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar202[0x1f]) goto LAB_015c3334;
            auVar100 = vsubps_avx(ZEXT1632(auVar12),auVar160);
            auVar12 = vfmadd213ps_fma(auVar100,local_6e0,auVar160);
            fVar108 = pre->depth_scale;
            auVar69._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar108;
            auVar69._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar108;
            auVar69._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar108;
            auVar69._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar108;
            auVar69._16_4_ = fVar108 * 0.0;
            auVar69._20_4_ = fVar108 * 0.0;
            auVar69._24_4_ = fVar108 * 0.0;
            auVar69._28_4_ = fVar108;
            local_200 = auVar185._0_32_;
            auVar100 = vcmpps_avx(local_200,auVar69,6);
            auVar118 = auVar137 & auVar100;
            auVar163 = ZEXT3264(local_5a0);
            auVar166 = ZEXT3264(CONCAT428(fStack_604,
                                          CONCAT424(fStack_608,
                                                    CONCAT420(fStack_60c,
                                                              CONCAT416(fStack_610,
                                                                        CONCAT412(fStack_614,
                                                                                  CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
            auVar171 = ZEXT3264(local_640);
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar118 >> 0x7f,0) == '\0') &&
                  (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0xbf,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar118[0x1f]) {
              auVar121 = ZEXT3264(local_6e0);
            }
            else {
              auVar120._8_4_ = 0xbf800000;
              auVar120._0_8_ = 0xbf800000bf800000;
              auVar120._12_4_ = 0xbf800000;
              auVar120._16_4_ = 0xbf800000;
              auVar120._20_4_ = 0xbf800000;
              auVar120._24_4_ = 0xbf800000;
              auVar120._28_4_ = 0xbf800000;
              auVar133._8_4_ = 0x40000000;
              auVar133._0_8_ = 0x4000000040000000;
              auVar133._12_4_ = 0x40000000;
              auVar133._16_4_ = 0x40000000;
              auVar133._20_4_ = 0x40000000;
              auVar133._24_4_ = 0x40000000;
              auVar133._28_4_ = 0x40000000;
              auVar12 = vfmadd213ps_fma(local_3a0,auVar133,auVar120);
              auVar157 = ZEXT1664(auVar12);
              local_240 = local_6e0;
              local_220 = ZEXT1632(auVar12);
              local_1dc = iVar8;
              local_1d0 = local_600;
              uStack_1c8 = uStack_5f8;
              local_1c0 = local_540._0_8_;
              uStack_1b8 = local_540._8_8_;
              local_1b0 = local_550._0_8_;
              uStack_1a8 = local_550._8_8_;
              local_700._0_8_ = (context->scene->geometries).items[local_648].ptr;
              auVar121 = ZEXT3264(local_6e0);
              local_3a0 = ZEXT1632(auVar12);
              auVar118 = local_3a0;
              if ((((Geometry *)local_700._0_8_)->mask & ray->mask) == 0) {
                bVar79 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar79 = 1,
                      ((Geometry *)local_700._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_700._8_24_ = auVar148._8_24_;
                local_720 = ZEXT1632(CONCAT88(auVar13._8_8_,context));
                auVar148 = vandps_avx(auVar100,auVar137);
                local_4c0 = ZEXT1632(CONCAT88(auVar11._8_8_,lVar85));
                fVar123 = (float)local_1e0;
                local_160[0] = (fVar123 + local_6e0._0_4_ + 0.0) * (float)local_420;
                local_160[1] = (fVar123 + local_6e0._4_4_ + 1.0) * local_420._4_4_;
                local_160[2] = (fVar123 + local_6e0._8_4_ + 2.0) * (float)uStack_418;
                local_160[3] = (fVar123 + local_6e0._12_4_ + 3.0) * uStack_418._4_4_;
                fStack_150 = (fVar123 + local_6e0._16_4_ + 4.0) * fStack_410;
                fStack_14c = (fVar123 + local_6e0._20_4_ + 5.0) * fStack_40c;
                fStack_148 = (fVar123 + local_6e0._24_4_ + 6.0) * fStack_408;
                fStack_144 = fVar123 + local_6e0._28_4_ + 7.0;
                local_3a0._0_8_ = auVar12._0_8_;
                local_3a0._8_8_ = auVar12._8_8_;
                local_140 = local_3a0._0_8_;
                uStack_138 = local_3a0._8_8_;
                uStack_130 = 0;
                uStack_128 = 0;
                local_6a0 = local_200;
                local_120 = local_200;
                uVar82 = vmovmskps_avx(auVar148);
                local_3a0 = auVar118;
                if (uVar82 == 0) {
                  bVar79 = 0;
LAB_015c381d:
                  auVar121 = ZEXT3264(local_6e0);
                  auVar180 = ZEXT3264(local_6c0);
                  auVar185 = ZEXT3264(local_6a0);
                  auVar190 = ZEXT3264(local_680);
                  auVar163 = ZEXT3264(local_5a0);
                  auVar166 = ZEXT3264(CONCAT428(fStack_604,
                                                CONCAT424(fStack_608,
                                                          CONCAT420(fStack_60c,
                                                                    CONCAT416(fStack_610,
                                                                              CONCAT412(fStack_614,
                                                                                        CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                  auVar171 = ZEXT3264(local_640);
                  context = (RayQueryContext *)local_720._0_8_;
                  lVar85 = local_4c0._0_8_;
                  pre = local_788;
                  fVar123 = (float)local_580;
                  fVar102 = local_580._4_4_;
                  fVar103 = (float)uStack_578;
                  fVar104 = uStack_578._4_4_;
                  fVar105 = (float)uStack_570;
                  fVar106 = uStack_570._4_4_;
                  fVar107 = (float)uStack_568;
                }
                else {
                  uVar80 = CONCAT44(0,uVar82 & 0xff);
                  auStack_738 = auVar112._8_24_;
                  local_740 = uVar80;
                  lVar85 = 0;
                  for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                    lVar85 = lVar85 + 1;
                  }
                  _local_780 = ZEXT1632(CONCAT88(auVar143._8_8_,lVar85));
                  stack0xfffffffffffffb04 = auVar16._4_28_;
                  local_500._0_4_ = ray->tfar;
                  pGVar84 = (Geometry *)local_700._0_8_;
                  _local_2e0 = auVar17;
                  do {
                    local_524 = local_160[(long)local_780];
                    local_520 = *(undefined4 *)((long)&local_140 + (long)local_780 * 4);
                    ray->tfar = *(float *)(local_120 + (long)local_780 * 4);
                    local_5f0.context = context->user;
                    fVar123 = 1.0 - local_524;
                    auVar143 = ZEXT416((uint)(local_524 * fVar123 * 4.0));
                    auVar11 = vfnmsub213ss_fma(ZEXT416((uint)local_524),ZEXT416((uint)local_524),
                                               auVar143);
                    auVar143 = vfmadd213ss_fma(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),
                                               auVar143);
                    fVar123 = fVar123 * -fVar123 * 0.5;
                    fVar102 = auVar11._0_4_ * 0.5;
                    auVar157 = ZEXT464((uint)fVar102);
                    fVar103 = auVar143._0_4_ * 0.5;
                    fVar104 = local_524 * local_524 * 0.5;
                    auVar144._0_4_ = fVar104 * (float)local_470._0_4_;
                    auVar144._4_4_ = fVar104 * (float)local_470._4_4_;
                    auVar144._8_4_ = fVar104 * fStack_468;
                    auVar144._12_4_ = fVar104 * fStack_464;
                    auVar128._4_4_ = fVar103;
                    auVar128._0_4_ = fVar103;
                    auVar128._8_4_ = fVar103;
                    auVar128._12_4_ = fVar103;
                    auVar143 = vfmadd132ps_fma(auVar128,auVar144,local_550);
                    auVar145._4_4_ = fVar102;
                    auVar145._0_4_ = fVar102;
                    auVar145._8_4_ = fVar102;
                    auVar145._12_4_ = fVar102;
                    auVar143 = vfmadd132ps_fma(auVar145,auVar143,local_540);
                    auVar129._4_4_ = fVar123;
                    auVar129._0_4_ = fVar123;
                    auVar129._8_4_ = fVar123;
                    auVar129._12_4_ = fVar123;
                    auVar76._8_8_ = uStack_5f8;
                    auVar76._0_8_ = local_600;
                    auVar143 = vfmadd132ps_fma(auVar129,auVar143,auVar76);
                    local_530 = vmovlps_avx(auVar143);
                    local_528 = vextractps_avx(auVar143,2);
                    local_51c = local_744;
                    local_518 = (int)local_648;
                    local_514 = (local_5f0.context)->instID[0];
                    local_510 = (local_5f0.context)->instPrimID[0];
                    local_794 = -1;
                    local_5f0.valid = &local_794;
                    local_5f0.geometryUserPtr = pGVar84->userPtr;
                    local_5f0.ray = (RTCRayN *)ray;
                    local_5f0.hit = (RTCHitN *)&local_530;
                    local_5f0.N = 1;
                    if (pGVar84->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015c36d5:
                      pcVar10 = *(code **)(*(byte **)(local_720._0_8_ + 0x10) + 0x10);
                      if ((pcVar10 != (code *)0x0) &&
                         (((**(byte **)(local_720._0_8_ + 0x10) & 2) != 0 ||
                          ((*(byte *)(local_700._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar157 = ZEXT1664(auVar157._0_16_);
                        auVar193 = ZEXT1664(auVar193._0_16_);
                        (*pcVar10)(&local_5f0);
                        if (*local_5f0.valid == 0) goto LAB_015c3723;
                      }
                      bVar79 = 1;
                      goto LAB_015c381d;
                    }
                    auVar157 = ZEXT464((uint)fVar102);
                    auVar193 = ZEXT1664(auVar193._0_16_);
                    (*pGVar84->occlusionFilterN)(&local_5f0);
                    if (*local_5f0.valid != 0) goto LAB_015c36d5;
LAB_015c3723:
                    ray->tfar = (float)local_500._0_4_;
                    uVar81 = local_740 ^ 1L << ((ulong)local_780 & 0x3f);
                    bVar79 = 0;
                    local_740 = uVar81;
                    lVar85 = 0;
                    for (uVar80 = uVar81; (uVar80 & 1) == 0;
                        uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                      lVar85 = lVar85 + 1;
                    }
                    local_780 = (undefined1  [8])lVar85;
                    auVar121 = ZEXT3264(local_6e0);
                    auVar180 = ZEXT3264(local_6c0);
                    auVar185 = ZEXT3264(local_6a0);
                    auVar190 = ZEXT3264(local_680);
                    auVar163 = ZEXT3264(local_5a0);
                    auVar166 = ZEXT3264(CONCAT428(fStack_604,
                                                  CONCAT424(fStack_608,
                                                            CONCAT420(fStack_60c,
                                                                      CONCAT416(fStack_610,
                                                                                CONCAT412(fStack_614
                                                                                          ,CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                    auVar171 = ZEXT3264(local_640);
                    context = (RayQueryContext *)local_720._0_8_;
                    pGVar84 = (Geometry *)local_700._0_8_;
                    lVar85 = local_4c0._0_8_;
                    pre = local_788;
                    fVar123 = (float)local_580;
                    fVar102 = local_580._4_4_;
                    fVar103 = (float)uStack_578;
                    fVar104 = uStack_578._4_4_;
                    fVar105 = (float)uStack_570;
                    fVar106 = uStack_570._4_4_;
                    fVar107 = (float)uStack_568;
                  } while (uVar81 != 0);
                }
              }
              bVar86 = (bool)(bVar86 | bVar79);
            }
          }
          local_6e0 = auVar121._0_32_;
          lVar85 = lVar85 + 8;
          auVar138 = ZEXT3264(local_5c0);
          auVar202 = ZEXT3264(local_4e0);
        } while ((int)lVar85 < iVar8);
      }
      if (bVar86) {
        return bVar86;
      }
      fVar123 = ray->tfar;
      auVar94._4_4_ = fVar123;
      auVar94._0_4_ = fVar123;
      auVar94._8_4_ = fVar123;
      auVar94._12_4_ = fVar123;
      auVar143 = vcmpps_avx(local_260,auVar94,2);
      uVar82 = vmovmskps_avx(auVar143);
      uVar82 = (uint)uVar87 & uVar82;
    } while (uVar82 != 0);
  }
  return bVar86;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }